

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  ulong uVar28;
  undefined8 uVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  byte bVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar79;
  long lVar80;
  long lVar81;
  Geometry *pGVar82;
  long lVar83;
  undefined8 unaff_R13;
  ulong uVar84;
  long lVar85;
  size_t sVar86;
  byte bVar87;
  ulong uVar88;
  float fVar89;
  float fVar90;
  float fVar142;
  float fVar144;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar102 [16];
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  float fVar163;
  float fVar164;
  vint4 bi_2;
  undefined1 auVar148 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar149 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar165;
  undefined1 auVar162 [64];
  undefined4 uVar166;
  float fVar167;
  vint4 bi_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar180;
  float fVar195;
  float fVar196;
  vint4 ai_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar198;
  undefined1 auVar191 [32];
  float fVar197;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  vint4 bi;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  vint4 ai;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  vint4 ai_1;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  float fVar219;
  float fVar221;
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 in_ZMM25 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [16];
  size_t local_808;
  undefined1 (*local_800) [32];
  Precalculations *local_7f8;
  ulong local_7f0;
  long local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar77 = (ulong)(byte)prim[1];
  fVar170 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar98 = vsubps_avx(auVar98,*(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  auVar181._0_4_ = fVar170 * auVar98._0_4_;
  auVar181._4_4_ = fVar170 * auVar98._4_4_;
  auVar181._8_4_ = fVar170 * auVar98._8_4_;
  auVar181._12_4_ = fVar170 * auVar98._12_4_;
  auVar148._0_4_ = fVar170 * auVar97._0_4_;
  auVar148._4_4_ = fVar170 * auVar97._4_4_;
  auVar148._8_4_ = fVar170 * auVar97._8_4_;
  auVar148._12_4_ = fVar170 * auVar97._12_4_;
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 4 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 5 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 6 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xb + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xc + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xd + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x12 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x13 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x14 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar227._4_4_ = auVar148._0_4_;
  auVar227._0_4_ = auVar148._0_4_;
  auVar227._8_4_ = auVar148._0_4_;
  auVar227._12_4_ = auVar148._0_4_;
  auVar26 = vshufps_avx(auVar148,auVar148,0x55);
  auVar94 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar170 = auVar94._0_4_;
  auVar199._0_4_ = fVar170 * auVar91._0_4_;
  fVar163 = auVar94._4_4_;
  auVar199._4_4_ = fVar163 * auVar91._4_4_;
  fVar164 = auVar94._8_4_;
  auVar199._8_4_ = fVar164 * auVar91._8_4_;
  fVar165 = auVar94._12_4_;
  auVar199._12_4_ = fVar165 * auVar91._12_4_;
  auVar102._0_4_ = auVar92._0_4_ * fVar170;
  auVar102._4_4_ = auVar92._4_4_ * fVar163;
  auVar102._8_4_ = auVar92._8_4_ * fVar164;
  auVar102._12_4_ = auVar92._12_4_ * fVar165;
  auVar100._0_4_ = auVar93._0_4_ * fVar170;
  auVar100._4_4_ = auVar93._4_4_ * fVar163;
  auVar100._8_4_ = auVar93._8_4_ * fVar164;
  auVar100._12_4_ = auVar93._12_4_ * fVar165;
  auVar94 = vfmadd231ps_fma(auVar199,auVar26,auVar97);
  auVar96 = vfmadd231ps_fma(auVar102,auVar26,auVar23);
  auVar26 = vfmadd231ps_fma(auVar100,auVar25,auVar26);
  auVar95 = vfmadd231ps_fma(auVar94,auVar227,auVar98);
  auVar96 = vfmadd231ps_fma(auVar96,auVar227,auVar99);
  auVar148 = vfmadd231ps_fma(auVar26,auVar24,auVar227);
  auVar228._4_4_ = auVar181._0_4_;
  auVar228._0_4_ = auVar181._0_4_;
  auVar228._8_4_ = auVar181._0_4_;
  auVar228._12_4_ = auVar181._0_4_;
  auVar26 = vshufps_avx(auVar181,auVar181,0x55);
  auVar94 = vshufps_avx(auVar181,auVar181,0xaa);
  auVar91 = vmulps_avx512vl(auVar94,auVar91);
  auVar182._0_4_ = auVar94._0_4_ * auVar92._0_4_;
  auVar182._4_4_ = auVar94._4_4_ * auVar92._4_4_;
  auVar182._8_4_ = auVar94._8_4_ * auVar92._8_4_;
  auVar182._12_4_ = auVar94._12_4_ * auVar92._12_4_;
  auVar171._0_4_ = auVar94._0_4_ * auVar93._0_4_;
  auVar171._4_4_ = auVar94._4_4_ * auVar93._4_4_;
  auVar171._8_4_ = auVar94._8_4_ * auVar93._8_4_;
  auVar171._12_4_ = auVar94._12_4_ * auVar93._12_4_;
  auVar92 = vfmadd231ps_avx512vl(auVar91,auVar26,auVar97);
  auVar97 = vfmadd231ps_fma(auVar182,auVar26,auVar23);
  auVar91 = vfmadd231ps_fma(auVar171,auVar26,auVar25);
  auVar93 = vfmadd231ps_avx512vl(auVar92,auVar228,auVar98);
  auVar92 = vfmadd231ps_fma(auVar97,auVar228,auVar99);
  auVar25 = vfmadd231ps_fma(auVar91,auVar228,auVar24);
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar98 = vandps_avx(auVar95,auVar216);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar98,auVar213,1);
  bVar9 = (bool)((byte)uVar84 & 1);
  auVar94._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar95._0_4_;
  bVar9 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar95._4_4_;
  bVar9 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar95._8_4_;
  bVar9 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar95._12_4_;
  auVar98 = vandps_avx(auVar96,auVar216);
  uVar84 = vcmpps_avx512vl(auVar98,auVar213,1);
  bVar9 = (bool)((byte)uVar84 & 1);
  auVar95._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar96._0_4_;
  bVar9 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar96._4_4_;
  bVar9 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar96._8_4_;
  bVar9 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar96._12_4_;
  auVar98 = vandps_avx(auVar148,auVar216);
  uVar84 = vcmpps_avx512vl(auVar98,auVar213,1);
  bVar9 = (bool)((byte)uVar84 & 1);
  auVar96._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar148._0_4_;
  bVar9 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar148._4_4_;
  bVar9 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar148._8_4_;
  bVar9 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar148._12_4_;
  auVar97 = vrcp14ps_avx512vl(auVar94);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = 0x3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar98 = vfnmadd213ps_fma(auVar94,auVar97,auVar214);
  auVar91 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar95);
  auVar98 = vfnmadd213ps_fma(auVar95,auVar97,auVar214);
  auVar23 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar96);
  auVar98 = vfnmadd213ps_fma(auVar96,auVar97,auVar214);
  auVar24 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar77 * 7 + 6);
  auVar98 = vpmovsxwd_avx(auVar98);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx512vl(auVar98,auVar93);
  auVar206._0_4_ = auVar91._0_4_ * auVar98._0_4_;
  auVar206._4_4_ = auVar91._4_4_ * auVar98._4_4_;
  auVar206._8_4_ = auVar91._8_4_ * auVar98._8_4_;
  auVar206._12_4_ = auVar91._12_4_ * auVar98._12_4_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar77 * 9 + 6);
  auVar98 = vpmovsxwd_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx512vl(auVar98,auVar93);
  auVar200._0_4_ = auVar91._0_4_ * auVar98._0_4_;
  auVar200._4_4_ = auVar91._4_4_ * auVar98._4_4_;
  auVar200._8_4_ = auVar91._8_4_ * auVar98._8_4_;
  auVar200._12_4_ = auVar91._12_4_ * auVar98._12_4_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar77 * 0xe + 6);
  auVar98 = vpmovsxwd_avx(auVar91);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vsubps_avx(auVar98,auVar92);
  auVar91 = vpbroadcastd_avx512vl();
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar98 = vpmovsxwd_avx(auVar99);
  auVar215._0_4_ = auVar23._0_4_ * auVar97._0_4_;
  auVar215._4_4_ = auVar23._4_4_ * auVar97._4_4_;
  auVar215._8_4_ = auVar23._8_4_ * auVar97._8_4_;
  auVar215._12_4_ = auVar23._12_4_ * auVar97._12_4_;
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar92);
  auVar168._0_4_ = auVar23._0_4_ * auVar98._0_4_;
  auVar168._4_4_ = auVar23._4_4_ * auVar98._4_4_;
  auVar168._8_4_ = auVar23._8_4_ * auVar98._8_4_;
  auVar168._12_4_ = auVar23._12_4_ * auVar98._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar77 * 0x15 + 6);
  auVar98 = vpmovsxwd_avx(auVar23);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar25);
  auVar183._0_4_ = auVar24._0_4_ * auVar98._0_4_;
  auVar183._4_4_ = auVar24._4_4_ * auVar98._4_4_;
  auVar183._8_4_ = auVar24._8_4_ * auVar98._8_4_;
  auVar183._12_4_ = auVar24._12_4_ * auVar98._12_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar77 * 0x17 + 6);
  auVar98 = vpmovsxwd_avx(auVar92);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar25);
  auVar101._0_4_ = auVar24._0_4_ * auVar98._0_4_;
  auVar101._4_4_ = auVar24._4_4_ * auVar98._4_4_;
  auVar101._8_4_ = auVar24._8_4_ * auVar98._8_4_;
  auVar101._12_4_ = auVar24._12_4_ * auVar98._12_4_;
  auVar98 = vpminsd_avx(auVar206,auVar200);
  auVar97 = vpminsd_avx(auVar215,auVar168);
  auVar98 = vmaxps_avx(auVar98,auVar97);
  auVar97 = vpminsd_avx(auVar183,auVar101);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar24._4_4_ = uVar166;
  auVar24._0_4_ = uVar166;
  auVar24._8_4_ = uVar166;
  auVar24._12_4_ = uVar166;
  auVar97 = vmaxps_avx512vl(auVar97,auVar24);
  auVar98 = vmaxps_avx(auVar98,auVar97);
  auVar25._8_4_ = 0x3f7ffffa;
  auVar25._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar25._12_4_ = 0x3f7ffffa;
  local_4b0 = vmulps_avx512vl(auVar98,auVar25);
  auVar98 = vpmaxsd_avx(auVar206,auVar200);
  auVar97 = vpmaxsd_avx(auVar215,auVar168);
  auVar98 = vminps_avx(auVar98,auVar97);
  auVar97 = vpmaxsd_avx(auVar183,auVar101);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar93._4_4_ = uVar166;
  auVar93._0_4_ = uVar166;
  auVar93._8_4_ = uVar166;
  auVar93._12_4_ = uVar166;
  auVar97 = vminps_avx512vl(auVar97,auVar93);
  auVar98 = vminps_avx(auVar98,auVar97);
  auVar26._8_4_ = 0x3f800003;
  auVar26._0_8_ = 0x3f8000033f800003;
  auVar26._12_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar26);
  uVar27 = vcmpps_avx512vl(local_4b0,auVar98,2);
  uVar29 = vpcmpgtd_avx512vl(auVar91,_DAT_01f4ad30);
  uVar84 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar27 & 0xf & (byte)uVar29));
  local_800 = (undefined1 (*) [32])local_100;
  auVar162 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar162);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar162 = ZEXT3264(auVar103);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar234 = ZEXT3264(auVar103);
  sVar86 = k;
  local_808 = k;
  local_7f8 = pre;
  do {
    if (uVar84 == 0) {
      return;
    }
    lVar83 = 0;
    for (uVar77 = uVar84; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      lVar83 = lVar83 + 1;
    }
    uVar5 = *(uint *)(prim + 2);
    uVar78 = *(uint *)(prim + lVar83 * 4 + 6);
    local_7f0 = (ulong)uVar78;
    pGVar82 = (context->scene->geometries).items[uVar5].ptr;
    lVar83 = *(long *)&pGVar82[1].time_range.upper;
    uVar77 = (ulong)*(uint *)(*(long *)&pGVar82->field_0x58 +
                             local_7f0 *
                             pGVar82[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    lVar80 = (long)pGVar82[1].intersectionFilterN * uVar77;
    auVar98 = *(undefined1 (*) [16])(lVar83 + lVar80);
    lVar81 = (long)pGVar82[1].intersectionFilterN * (uVar77 + 1);
    auVar97 = *(undefined1 (*) [16])(lVar83 + lVar81);
    auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar86 * 4)),
                            ZEXT416(*(uint *)(ray + sVar86 * 4 + 0x40)),0x1c);
    auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + sVar86 * 4 + 0x80)),0x28);
    iVar6 = (int)pGVar82[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar149._8_4_ = 0xbeaaaaab;
    auVar149._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar149._12_4_ = 0xbeaaaaab;
    auVar148 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar82[2].intersectionFilterN +
                                 uVar77 * (long)pGVar82[2].pointQueryFunc),auVar98,auVar149);
    auVar92 = vfmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar82[2].intersectionFilterN +
                               (long)pGVar82[2].pointQueryFunc * (uVar77 + 1)),auVar97,auVar149);
    auVar23 = vsubps_avx(auVar98,auVar91);
    uVar166 = auVar23._0_4_;
    auVar184._4_4_ = uVar166;
    auVar184._0_4_ = uVar166;
    auVar184._8_4_ = uVar166;
    auVar184._12_4_ = uVar166;
    auVar99 = vshufps_avx(auVar23,auVar23,0x55);
    aVar3 = pre->ray_space[k].vx.field_0;
    aVar4 = pre->ray_space[k].vy.field_0;
    auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
    fVar170 = pre->ray_space[k].vz.field_0.m128[0];
    fVar163 = pre->ray_space[k].vz.field_0.m128[1];
    fVar164 = pre->ray_space[k].vz.field_0.m128[2];
    fVar165 = pre->ray_space[k].vz.field_0.m128[3];
    auVar220._0_4_ = fVar170 * auVar23._0_4_;
    auVar220._4_4_ = fVar163 * auVar23._4_4_;
    auVar220._8_4_ = fVar164 * auVar23._8_4_;
    auVar220._12_4_ = fVar165 * auVar23._12_4_;
    auVar99 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar4,auVar99);
    auVar24 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar3,auVar184);
    auVar23 = vsubps_avx(auVar148,auVar91);
    uVar166 = auVar23._0_4_;
    auVar185._4_4_ = uVar166;
    auVar185._0_4_ = uVar166;
    auVar185._8_4_ = uVar166;
    auVar185._12_4_ = uVar166;
    auVar99 = vshufps_avx(auVar23,auVar23,0x55);
    auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
    auVar222._0_4_ = fVar170 * auVar23._0_4_;
    auVar222._4_4_ = fVar163 * auVar23._4_4_;
    auVar222._8_4_ = fVar164 * auVar23._8_4_;
    auVar222._12_4_ = fVar165 * auVar23._12_4_;
    auVar99 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar4,auVar99);
    auVar25 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar3,auVar185);
    auVar23 = vsubps_avx(auVar92,auVar91);
    uVar166 = auVar23._0_4_;
    auVar186._4_4_ = uVar166;
    auVar186._0_4_ = uVar166;
    auVar186._8_4_ = uVar166;
    auVar186._12_4_ = uVar166;
    auVar99 = vshufps_avx(auVar23,auVar23,0x55);
    auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
    auVar224._0_4_ = fVar170 * auVar23._0_4_;
    auVar224._4_4_ = fVar163 * auVar23._4_4_;
    auVar224._8_4_ = fVar164 * auVar23._8_4_;
    auVar224._12_4_ = fVar165 * auVar23._12_4_;
    auVar99 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar4,auVar99);
    auVar23 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar3,auVar186);
    auVar99 = vsubps_avx(auVar97,auVar91);
    uVar166 = auVar99._0_4_;
    auVar172._4_4_ = uVar166;
    auVar172._0_4_ = uVar166;
    auVar172._8_4_ = uVar166;
    auVar172._12_4_ = uVar166;
    auVar91 = vshufps_avx(auVar99,auVar99,0x55);
    auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
    auVar229._0_4_ = fVar170 * auVar99._0_4_;
    auVar229._4_4_ = fVar163 * auVar99._4_4_;
    auVar229._8_4_ = fVar164 * auVar99._8_4_;
    auVar229._12_4_ = fVar165 * auVar99._12_4_;
    auVar91 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar4,auVar91);
    local_7e8 = (long)iVar6;
    lVar85 = local_7e8 * 0x44;
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar85);
    auVar93 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar3,auVar172);
    uVar166 = auVar24._0_4_;
    local_600._4_4_ = uVar166;
    local_600._0_4_ = uVar166;
    local_600._8_4_ = uVar166;
    local_600._12_4_ = uVar166;
    local_600._16_4_ = uVar166;
    local_600._20_4_ = uVar166;
    local_600._24_4_ = uVar166;
    local_600._28_4_ = uVar166;
    auVar104 = auVar162._0_32_;
    local_620 = vpermps_avx512vl(auVar104,ZEXT1632(auVar24));
    auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x484);
    local_640 = vbroadcastss_avx512vl(auVar25);
    local_660 = vpermps_avx512vl(auVar104,ZEXT1632(auVar25));
    auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x908);
    local_680 = vbroadcastss_avx512vl(auVar23);
    auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0xd8c);
    local_6a0 = vpermps_avx512vl(auVar104,ZEXT1632(auVar23));
    uVar166 = auVar93._0_4_;
    local_6c0._4_4_ = uVar166;
    local_6c0._0_4_ = uVar166;
    fStack_6b8 = (float)uVar166;
    fStack_6b4 = (float)uVar166;
    fStack_6b0 = (float)uVar166;
    fStack_6ac = (float)uVar166;
    fStack_6a8 = (float)uVar166;
    register0x0000139c = uVar166;
    _local_6e0 = vpermps_avx512vl(auVar104,ZEXT1632(auVar93));
    auVar104 = vmulps_avx512vl(_local_6c0,auVar115);
    auVar105 = vmulps_avx512vl(_local_6e0,auVar115);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,local_680);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar116,local_6a0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,local_640);
    auVar106 = vfmadd231ps_avx512vl(auVar105,auVar117,local_660);
    auVar26 = vfmadd231ps_fma(auVar104,auVar103,local_600);
    auVar211 = ZEXT1664(auVar26);
    auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar85);
    auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x484);
    auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x908);
    auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0xd8c);
    auVar94 = vfmadd231ps_fma(auVar106,auVar103,local_620);
    auVar205 = ZEXT1664(auVar94);
    auVar106 = vmulps_avx512vl(_local_6c0,auVar113);
    auVar107 = vmulps_avx512vl(_local_6e0,auVar113);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_680);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_6a0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_640);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_660);
    auVar96 = vfmadd231ps_fma(auVar106,auVar104,local_600);
    auVar217 = ZEXT1664(auVar96);
    auVar95 = vfmadd231ps_fma(auVar107,auVar104,local_620);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar26));
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar94));
    auVar108 = vmulps_avx512vl(ZEXT1632(auVar94),auVar106);
    auVar109 = vmulps_avx512vl(ZEXT1632(auVar26),auVar107);
    auVar108 = vsubps_avx512vl(auVar108,auVar109);
    auVar91 = vshufps_avx(auVar148,auVar148,0xff);
    local_3a0 = vbroadcastsd_avx512vl(auVar91);
    auVar91 = vshufps_avx(auVar92,auVar92,0xff);
    local_3c0 = vbroadcastsd_avx512vl(auVar91);
    local_3e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar83 + 0xc + lVar81)));
    auVar109 = vmulps_avx512vl(local_3e0,auVar115);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,local_3c0);
    local_400 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar83 + 0xc + lVar80)));
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar117,local_3a0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar103,local_400);
    auVar110 = vmulps_avx512vl(local_3e0,auVar113);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_3c0);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,local_3a0);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar104,local_400);
    auVar111 = vmulps_avx512vl(auVar107,auVar107);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,auVar106);
    auVar112 = vmaxps_avx512vl(auVar109,auVar110);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    uVar27 = vcmpps_avx512vl(auVar108,auVar111,2);
    auVar91 = vinsertps_avx512f(auVar24,local_400._0_16_,0x30);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar100 = vandps_avx512vl(auVar91,auVar99);
    auVar91 = vblendps_avx(auVar25,auVar148,8);
    auVar91 = vandps_avx512vl(auVar91,auVar99);
    auVar100 = vmaxps_avx512vl(auVar100,auVar91);
    auVar91 = vblendps_avx(auVar23,auVar92,8);
    auVar101 = vandps_avx512vl(auVar91,auVar99);
    auVar91 = vinsertps_avx512f(auVar93,local_3e0._0_16_,0x30);
    auVar91 = vandps_avx512vl(auVar91,auVar99);
    auVar91 = vmaxps_avx512vl(auVar101,auVar91);
    auVar91 = vmaxps_avx(auVar100,auVar91);
    auVar99 = vmovshdup_avx(auVar91);
    auVar99 = vmaxss_avx(auVar99,auVar91);
    auVar91 = vshufpd_avx(auVar91,auVar91,1);
    auVar91 = vmaxss_avx(auVar91,auVar99);
    auVar99 = vcvtsi2ss_avx512f(in_ZMM25._0_16_,iVar6);
    local_7c0._0_16_ = auVar99;
    auVar108._0_4_ = auVar99._0_4_;
    auVar108._4_4_ = auVar108._0_4_;
    auVar108._8_4_ = auVar108._0_4_;
    auVar108._12_4_ = auVar108._0_4_;
    auVar108._16_4_ = auVar108._0_4_;
    auVar108._20_4_ = auVar108._0_4_;
    auVar108._24_4_ = auVar108._0_4_;
    auVar108._28_4_ = auVar108._0_4_;
    uVar29 = vcmpps_avx512vl(auVar108,_DAT_01f7b060,0xe);
    bVar87 = (byte)uVar27 & (byte)uVar29;
    fVar170 = auVar91._0_4_ * 4.7683716e-07;
    local_820 = ZEXT416((uint)fVar170);
    auVar111 = auVar234._0_32_;
    local_7a0 = vpermps_avx512vl(auVar111,ZEXT1632(auVar24));
    auVar233 = ZEXT3264(local_7a0);
    local_460 = vpermps_avx512vl(auVar111,ZEXT1632(auVar25));
    local_480 = vpermps_avx512vl(auVar111,ZEXT1632(auVar23));
    local_4a0 = vpermps_avx512vl(auVar111,ZEXT1632(auVar93));
    local_760 = *(undefined4 *)(ray + sVar86 * 4 + 0xc0);
    uStack_75c = 0;
    uStack_758 = 0;
    uStack_754 = 0;
    auVar141 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar141);
    auVar141 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar141);
    local_860 = auVar98._0_8_;
    uStack_858 = auVar98._8_8_;
    local_880 = auVar148._0_8_;
    uStack_878 = auVar148._8_8_;
    local_890 = auVar92._0_8_;
    uStack_888 = auVar92._8_8_;
    local_870._0_4_ = auVar97._0_4_;
    fVar163 = (float)local_870;
    local_870._4_4_ = auVar97._4_4_;
    fVar164 = local_870._4_4_;
    uStack_868._0_4_ = auVar97._8_4_;
    fVar165 = (float)uStack_868;
    uStack_868._4_4_ = auVar97._12_4_;
    fVar75 = uStack_868._4_4_;
    local_870 = auVar97._0_8_;
    uStack_868 = auVar97._8_8_;
    if (bVar87 != 0) {
      in_ZMM25 = ZEXT3264(local_4a0);
      auVar113 = vmulps_avx512vl(local_4a0,auVar113);
      auVar114 = vfmadd213ps_avx512vl(auVar114,local_480,auVar113);
      auVar105 = vfmadd213ps_avx512vl(auVar105,local_460,auVar114);
      auVar114 = vfmadd213ps_avx512vl(auVar104,local_7a0,auVar105);
      auVar115 = vmulps_avx512vl(local_4a0,auVar115);
      auVar116 = vfmadd213ps_avx512vl(auVar116,local_480,auVar115);
      auVar105 = vfmadd213ps_avx512vl(auVar117,local_460,auVar116);
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x1210);
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x1694);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x1b18);
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 + 0x1f9c);
      auVar113 = vfmadd213ps_avx512vl(auVar103,local_7a0,auVar105);
      auVar103 = vmulps_avx512vl(_local_6c0,auVar104);
      auVar105 = vmulps_avx512vl(_local_6e0,auVar104);
      auVar104 = vmulps_avx512vl(local_4a0,auVar104);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,local_680);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_6a0);
      auVar115 = vfmadd231ps_avx512vl(auVar104,local_480,auVar115);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar116,local_640);
      auVar104 = vfmadd231ps_avx512vl(auVar105,auVar116,local_660);
      auVar105 = vfmadd231ps_avx512vl(auVar115,local_460,auVar116);
      auVar111 = vfmadd231ps_avx512vl(auVar103,auVar117,local_600);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,local_620);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x1210);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x1b18);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x1f9c);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_7a0,auVar117);
      auVar117 = vmulps_avx512vl(_local_6c0,auVar115);
      auVar112 = vmulps_avx512vl(_local_6e0,auVar115);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar234 = ZEXT3264(auVar118);
      auVar115 = vmulps_avx512vl(local_4a0,auVar115);
      auVar118 = vfmadd231ps_avx512vl(auVar117,auVar116,local_680);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_6a0);
      auVar116 = vfmadd231ps_avx512vl(auVar115,local_480,auVar116);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 + 0x1694);
      auVar115 = vfmadd231ps_avx512vl(auVar118,auVar117,local_640);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_660);
      auVar117 = vfmadd231ps_avx512vl(auVar116,local_460,auVar117);
      auVar116 = vfmadd231ps_avx512vl(auVar115,auVar103,local_600);
      auVar115 = vfmadd231ps_avx512vl(auVar112,auVar103,local_620);
      auVar112 = vfmadd231ps_avx512vl(auVar117,local_7a0,auVar103);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar103 = vandps_avx(auVar111,auVar230);
      auVar117 = vandps_avx(auVar104,auVar230);
      auVar117 = vmaxps_avx(auVar103,auVar117);
      auVar103 = vandps_avx(auVar105,auVar230);
      auVar103 = vmaxps_avx(auVar117,auVar103);
      auVar226._4_4_ = fVar170;
      auVar226._0_4_ = fVar170;
      auVar226._8_4_ = fVar170;
      auVar226._12_4_ = fVar170;
      auVar226._16_4_ = fVar170;
      auVar226._20_4_ = fVar170;
      auVar226._24_4_ = fVar170;
      auVar226._28_4_ = fVar170;
      uVar77 = vcmpps_avx512vl(auVar103,auVar226,1);
      bVar9 = (bool)((byte)uVar77 & 1);
      auVar118._0_4_ = (float)((uint)bVar9 * auVar106._0_4_ | (uint)!bVar9 * auVar111._0_4_);
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar118._4_4_ = (float)((uint)bVar9 * auVar106._4_4_ | (uint)!bVar9 * auVar111._4_4_);
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar118._8_4_ = (float)((uint)bVar9 * auVar106._8_4_ | (uint)!bVar9 * auVar111._8_4_);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar118._12_4_ = (float)((uint)bVar9 * auVar106._12_4_ | (uint)!bVar9 * auVar111._12_4_);
      bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar118._16_4_ = (float)((uint)bVar9 * auVar106._16_4_ | (uint)!bVar9 * auVar111._16_4_);
      bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar118._20_4_ = (float)((uint)bVar9 * auVar106._20_4_ | (uint)!bVar9 * auVar111._20_4_);
      bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar118._24_4_ = (float)((uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * auVar111._24_4_);
      bVar9 = SUB81(uVar77 >> 7,0);
      auVar118._28_4_ = (uint)bVar9 * auVar106._28_4_ | (uint)!bVar9 * auVar111._28_4_;
      bVar9 = (bool)((byte)uVar77 & 1);
      auVar119._0_4_ = (float)((uint)bVar9 * auVar107._0_4_ | (uint)!bVar9 * auVar104._0_4_);
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar119._4_4_ = (float)((uint)bVar9 * auVar107._4_4_ | (uint)!bVar9 * auVar104._4_4_);
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar119._8_4_ = (float)((uint)bVar9 * auVar107._8_4_ | (uint)!bVar9 * auVar104._8_4_);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar119._12_4_ = (float)((uint)bVar9 * auVar107._12_4_ | (uint)!bVar9 * auVar104._12_4_);
      bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar119._16_4_ = (float)((uint)bVar9 * auVar107._16_4_ | (uint)!bVar9 * auVar104._16_4_);
      bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar119._20_4_ = (float)((uint)bVar9 * auVar107._20_4_ | (uint)!bVar9 * auVar104._20_4_);
      bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar119._24_4_ = (float)((uint)bVar9 * auVar107._24_4_ | (uint)!bVar9 * auVar104._24_4_);
      bVar9 = SUB81(uVar77 >> 7,0);
      auVar119._28_4_ = (uint)bVar9 * auVar107._28_4_ | (uint)!bVar9 * auVar104._28_4_;
      vandps_avx512vl(auVar116,auVar230);
      auVar103 = vandps_avx(auVar115,auVar230);
      auVar117 = vmaxps_avx(auVar119,auVar103);
      auVar103 = vandps_avx(auVar112,auVar230);
      auVar103 = vmaxps_avx(auVar117,auVar103);
      uVar77 = vcmpps_avx512vl(auVar103,auVar226,1);
      bVar9 = (bool)((byte)uVar77 & 1);
      auVar112._0_4_ = (uint)bVar9 * auVar106._0_4_ | (uint)!bVar9 * auVar116._0_4_;
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar9 * auVar106._4_4_ | (uint)!bVar9 * auVar116._4_4_;
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar9 * auVar106._8_4_ | (uint)!bVar9 * auVar116._8_4_;
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar9 * auVar106._12_4_ | (uint)!bVar9 * auVar116._12_4_;
      bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar9 * auVar106._16_4_ | (uint)!bVar9 * auVar116._16_4_;
      bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar9 * auVar106._20_4_ | (uint)!bVar9 * auVar116._20_4_;
      bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * auVar116._24_4_;
      bVar9 = SUB81(uVar77 >> 7,0);
      auVar112._28_4_ = (uint)bVar9 * auVar106._28_4_ | (uint)!bVar9 * auVar116._28_4_;
      bVar9 = (bool)((byte)uVar77 & 1);
      auVar120._0_4_ = (float)((uint)bVar9 * auVar107._0_4_ | (uint)!bVar9 * auVar115._0_4_);
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar120._4_4_ = (float)((uint)bVar9 * auVar107._4_4_ | (uint)!bVar9 * auVar115._4_4_);
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar120._8_4_ = (float)((uint)bVar9 * auVar107._8_4_ | (uint)!bVar9 * auVar115._8_4_);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar120._12_4_ = (float)((uint)bVar9 * auVar107._12_4_ | (uint)!bVar9 * auVar115._12_4_);
      bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar120._16_4_ = (float)((uint)bVar9 * auVar107._16_4_ | (uint)!bVar9 * auVar115._16_4_);
      bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar120._20_4_ = (float)((uint)bVar9 * auVar107._20_4_ | (uint)!bVar9 * auVar115._20_4_);
      bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar120._24_4_ = (float)((uint)bVar9 * auVar107._24_4_ | (uint)!bVar9 * auVar115._24_4_);
      bVar9 = SUB81(uVar77 >> 7,0);
      auVar120._28_4_ = (uint)bVar9 * auVar107._28_4_ | (uint)!bVar9 * auVar115._28_4_;
      auVar225._8_4_ = 0x80000000;
      auVar225._0_8_ = 0x8000000080000000;
      auVar225._12_4_ = 0x80000000;
      auVar225._16_4_ = 0x80000000;
      auVar225._20_4_ = 0x80000000;
      auVar225._24_4_ = 0x80000000;
      auVar225._28_4_ = 0x80000000;
      auVar106 = vxorps_avx512vl(auVar112,auVar225);
      auVar102 = vxorps_avx512vl(local_620._0_16_,local_620._0_16_);
      auVar103 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar102));
      auVar97 = vfmadd231ps_fma(auVar103,auVar119,auVar119);
      auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar97));
      auVar231._8_4_ = 0xbf000000;
      auVar231._0_8_ = 0xbf000000bf000000;
      auVar231._12_4_ = 0xbf000000;
      auVar231._16_4_ = 0xbf000000;
      auVar231._20_4_ = 0xbf000000;
      auVar231._24_4_ = 0xbf000000;
      auVar231._28_4_ = 0xbf000000;
      fVar219 = auVar116._0_4_;
      fVar221 = auVar116._4_4_;
      fVar167 = auVar116._8_4_;
      fVar180 = auVar116._12_4_;
      fVar179 = auVar116._16_4_;
      fVar195 = auVar116._20_4_;
      fVar196 = auVar116._24_4_;
      auVar103._4_4_ = fVar221 * fVar221 * fVar221 * auVar97._4_4_ * -0.5;
      auVar103._0_4_ = fVar219 * fVar219 * fVar219 * auVar97._0_4_ * -0.5;
      auVar103._8_4_ = fVar167 * fVar167 * fVar167 * auVar97._8_4_ * -0.5;
      auVar103._12_4_ = fVar180 * fVar180 * fVar180 * auVar97._12_4_ * -0.5;
      auVar103._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
      auVar103._20_4_ = fVar195 * fVar195 * fVar195 * -0.0;
      auVar103._24_4_ = fVar196 * fVar196 * fVar196 * -0.0;
      auVar103._28_4_ = 0;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar104,auVar116);
      auVar117._4_4_ = auVar119._4_4_ * auVar103._4_4_;
      auVar117._0_4_ = auVar119._0_4_ * auVar103._0_4_;
      auVar117._8_4_ = auVar119._8_4_ * auVar103._8_4_;
      auVar117._12_4_ = auVar119._12_4_ * auVar103._12_4_;
      auVar117._16_4_ = auVar119._16_4_ * auVar103._16_4_;
      auVar117._20_4_ = auVar119._20_4_ * auVar103._20_4_;
      auVar117._24_4_ = auVar119._24_4_ * auVar103._24_4_;
      auVar117._28_4_ = auVar116._28_4_;
      auVar116._4_4_ = auVar103._4_4_ * -auVar118._4_4_;
      auVar116._0_4_ = auVar103._0_4_ * -auVar118._0_4_;
      auVar116._8_4_ = auVar103._8_4_ * -auVar118._8_4_;
      auVar116._12_4_ = auVar103._12_4_ * -auVar118._12_4_;
      auVar116._16_4_ = auVar103._16_4_ * -auVar118._16_4_;
      auVar116._20_4_ = auVar103._20_4_ * -auVar118._20_4_;
      auVar116._24_4_ = auVar103._24_4_ * -auVar118._24_4_;
      auVar116._28_4_ = auVar118._28_4_ ^ 0x80000000;
      auVar107 = vmulps_avx512vl(auVar103,ZEXT1632(auVar102));
      auVar118 = ZEXT1632(auVar102);
      auVar103 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar118);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar120,auVar120);
      auVar105 = vrsqrt14ps_avx512vl(auVar103);
      auVar103 = vmulps_avx512vl(auVar103,auVar231);
      fVar219 = auVar105._0_4_;
      fVar221 = auVar105._4_4_;
      fVar167 = auVar105._8_4_;
      fVar180 = auVar105._12_4_;
      fVar179 = auVar105._16_4_;
      fVar195 = auVar105._20_4_;
      fVar196 = auVar105._24_4_;
      auVar115._4_4_ = fVar221 * fVar221 * fVar221 * auVar103._4_4_;
      auVar115._0_4_ = fVar219 * fVar219 * fVar219 * auVar103._0_4_;
      auVar115._8_4_ = fVar167 * fVar167 * fVar167 * auVar103._8_4_;
      auVar115._12_4_ = fVar180 * fVar180 * fVar180 * auVar103._12_4_;
      auVar115._16_4_ = fVar179 * fVar179 * fVar179 * auVar103._16_4_;
      auVar115._20_4_ = fVar195 * fVar195 * fVar195 * auVar103._20_4_;
      auVar115._24_4_ = fVar196 * fVar196 * fVar196 * auVar103._24_4_;
      auVar115._28_4_ = 0xbf000000;
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar104,auVar105);
      auVar104._4_4_ = auVar120._4_4_ * auVar115._4_4_;
      auVar104._0_4_ = auVar120._0_4_ * auVar115._0_4_;
      auVar104._8_4_ = auVar120._8_4_ * auVar115._8_4_;
      auVar104._12_4_ = auVar120._12_4_ * auVar115._12_4_;
      auVar104._16_4_ = auVar120._16_4_ * auVar115._16_4_;
      auVar104._20_4_ = auVar120._20_4_ * auVar115._20_4_;
      auVar104._24_4_ = auVar120._24_4_ * auVar115._24_4_;
      auVar104._28_4_ = auVar105._28_4_;
      auVar105._4_4_ = auVar115._4_4_ * auVar106._4_4_;
      auVar105._0_4_ = auVar115._0_4_ * auVar106._0_4_;
      auVar105._8_4_ = auVar115._8_4_ * auVar106._8_4_;
      auVar105._12_4_ = auVar115._12_4_ * auVar106._12_4_;
      auVar105._16_4_ = auVar115._16_4_ * auVar106._16_4_;
      auVar105._20_4_ = auVar115._20_4_ * auVar106._20_4_;
      auVar105._24_4_ = auVar115._24_4_ * auVar106._24_4_;
      auVar105._28_4_ = auVar103._28_4_;
      auVar103 = vmulps_avx512vl(auVar115,auVar118);
      auVar97 = vfmadd213ps_fma(auVar117,auVar109,ZEXT1632(auVar26));
      auVar91 = vfmadd213ps_fma(auVar116,auVar109,ZEXT1632(auVar94));
      auVar115 = vfmadd213ps_avx512vl(auVar107,auVar109,auVar113);
      auVar111 = vfmadd213ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar96));
      auVar26 = vfnmadd213ps_fma(auVar117,auVar109,ZEXT1632(auVar26));
      auVar99 = vfmadd213ps_fma(auVar105,auVar110,ZEXT1632(auVar95));
      auVar94 = vfnmadd213ps_fma(auVar116,auVar109,ZEXT1632(auVar94));
      auVar23 = vfmadd213ps_fma(auVar103,auVar110,auVar114);
      auVar100 = vfnmadd231ps_fma(auVar113,auVar109,auVar107);
      auVar96 = vfnmadd213ps_fma(auVar104,auVar110,ZEXT1632(auVar96));
      auVar95 = vfnmadd213ps_fma(auVar105,auVar110,ZEXT1632(auVar95));
      auVar101 = vfnmadd231ps_fma(auVar114,auVar110,auVar103);
      auVar116 = vsubps_avx512vl(auVar111,ZEXT1632(auVar26));
      auVar103 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar94));
      auVar117 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar100));
      auVar114._4_4_ = auVar103._4_4_ * auVar100._4_4_;
      auVar114._0_4_ = auVar103._0_4_ * auVar100._0_4_;
      auVar114._8_4_ = auVar103._8_4_ * auVar100._8_4_;
      auVar114._12_4_ = auVar103._12_4_ * auVar100._12_4_;
      auVar114._16_4_ = auVar103._16_4_ * 0.0;
      auVar114._20_4_ = auVar103._20_4_ * 0.0;
      auVar114._24_4_ = auVar103._24_4_ * 0.0;
      auVar114._28_4_ = auVar107._28_4_;
      auVar24 = vfmsub231ps_fma(auVar114,ZEXT1632(auVar94),auVar117);
      auVar113._4_4_ = auVar117._4_4_ * auVar26._4_4_;
      auVar113._0_4_ = auVar117._0_4_ * auVar26._0_4_;
      auVar113._8_4_ = auVar117._8_4_ * auVar26._8_4_;
      auVar113._12_4_ = auVar117._12_4_ * auVar26._12_4_;
      auVar113._16_4_ = auVar117._16_4_ * 0.0;
      auVar113._20_4_ = auVar117._20_4_ * 0.0;
      auVar113._24_4_ = auVar117._24_4_ * 0.0;
      auVar113._28_4_ = auVar117._28_4_;
      auVar25 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar100),auVar116);
      auVar106._4_4_ = auVar94._4_4_ * auVar116._4_4_;
      auVar106._0_4_ = auVar94._0_4_ * auVar116._0_4_;
      auVar106._8_4_ = auVar94._8_4_ * auVar116._8_4_;
      auVar106._12_4_ = auVar94._12_4_ * auVar116._12_4_;
      auVar106._16_4_ = auVar116._16_4_ * 0.0;
      auVar106._20_4_ = auVar116._20_4_ * 0.0;
      auVar106._24_4_ = auVar116._24_4_ * 0.0;
      auVar106._28_4_ = auVar116._28_4_;
      auVar93 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar26),auVar103);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar118,ZEXT1632(auVar25));
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar118,ZEXT1632(auVar24));
      auVar112 = ZEXT1632(auVar102);
      uVar77 = vcmpps_avx512vl(auVar103,auVar112,2);
      bVar76 = (byte)uVar77;
      fVar89 = (float)((uint)(bVar76 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar96._0_4_);
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      fVar142 = (float)((uint)bVar9 * auVar97._4_4_ | (uint)!bVar9 * auVar96._4_4_);
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      fVar144 = (float)((uint)bVar9 * auVar97._8_4_ | (uint)!bVar9 * auVar96._8_4_);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      fVar146 = (float)((uint)bVar9 * auVar97._12_4_ | (uint)!bVar9 * auVar96._12_4_);
      auVar114 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar89))));
      fVar90 = (float)((uint)(bVar76 & 1) * auVar91._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar95._0_4_);
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      fVar143 = (float)((uint)bVar9 * auVar91._4_4_ | (uint)!bVar9 * auVar95._4_4_);
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      fVar145 = (float)((uint)bVar9 * auVar91._8_4_ | (uint)!bVar9 * auVar95._8_4_);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      fVar147 = (float)((uint)bVar9 * auVar91._12_4_ | (uint)!bVar9 * auVar95._12_4_);
      auVar113 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar145,CONCAT44(fVar143,fVar90))));
      auVar121._0_4_ =
           (float)((uint)(bVar76 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar101._0_4_)
      ;
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar9 * auVar115._4_4_ | (uint)!bVar9 * auVar101._4_4_);
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * auVar101._8_4_);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar9 * auVar115._12_4_ | (uint)!bVar9 * auVar101._12_4_);
      fVar219 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar115._16_4_);
      auVar121._16_4_ = fVar219;
      fVar221 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar115._20_4_);
      auVar121._20_4_ = fVar221;
      fVar167 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar115._24_4_);
      auVar121._24_4_ = fVar167;
      iVar1 = (uint)(byte)(uVar77 >> 7) * auVar115._28_4_;
      auVar121._28_4_ = iVar1;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar26),auVar111);
      auVar122._0_4_ =
           (uint)(bVar76 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar97._0_4_;
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * auVar97._4_4_;
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * auVar97._8_4_;
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * auVar97._12_4_;
      auVar122._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_;
      auVar122._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_;
      auVar122._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_;
      auVar122._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar99));
      auVar123._0_4_ =
           (float)((uint)(bVar76 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar24._0_4_);
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * auVar24._4_4_);
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * auVar24._8_4_);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * auVar24._12_4_);
      fVar180 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_);
      auVar123._16_4_ = fVar180;
      fVar179 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_);
      auVar123._20_4_ = fVar179;
      fVar195 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_);
      auVar123._24_4_ = fVar195;
      auVar123._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar23));
      auVar124._0_4_ =
           (float)((uint)(bVar76 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar91._0_4_);
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar124._4_4_ = (float)((uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * auVar91._4_4_);
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar124._8_4_ = (float)((uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * auVar91._8_4_);
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar124._12_4_ = (float)((uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * auVar91._12_4_);
      fVar197 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_);
      auVar124._16_4_ = fVar197;
      fVar196 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_);
      auVar124._20_4_ = fVar196;
      fVar198 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_);
      auVar124._24_4_ = fVar198;
      iVar2 = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
      auVar124._28_4_ = iVar2;
      auVar125._0_4_ =
           (uint)(bVar76 & 1) * (int)auVar26._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar111._0_4_;
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar9 * (int)auVar26._4_4_ | (uint)!bVar9 * auVar111._4_4_;
      bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar9 * (int)auVar26._8_4_ | (uint)!bVar9 * auVar111._8_4_;
      bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar9 * (int)auVar26._12_4_ | (uint)!bVar9 * auVar111._12_4_;
      auVar125._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar111._16_4_;
      auVar125._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar111._20_4_;
      auVar125._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar111._24_4_;
      auVar125._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar111._28_4_;
      bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar106 = vsubps_avx512vl(auVar125,auVar114);
      auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar94._12_4_ |
                                               (uint)!bVar13 * auVar99._12_4_,
                                               CONCAT48((uint)bVar11 * (int)auVar94._8_4_ |
                                                        (uint)!bVar11 * auVar99._8_4_,
                                                        CONCAT44((uint)bVar9 * (int)auVar94._4_4_ |
                                                                 (uint)!bVar9 * auVar99._4_4_,
                                                                 (uint)(bVar76 & 1) *
                                                                 (int)auVar94._0_4_ |
                                                                 (uint)!(bool)(bVar76 & 1) *
                                                                 auVar99._0_4_)))),auVar113);
      auVar211 = ZEXT3264(auVar117);
      auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar100._12_4_ |
                                               (uint)!bVar14 * auVar23._12_4_,
                                               CONCAT48((uint)bVar12 * (int)auVar100._8_4_ |
                                                        (uint)!bVar12 * auVar23._8_4_,
                                                        CONCAT44((uint)bVar10 * (int)auVar100._4_4_
                                                                 | (uint)!bVar10 * auVar23._4_4_,
                                                                 (uint)(bVar76 & 1) *
                                                                 (int)auVar100._0_4_ |
                                                                 (uint)!(bool)(bVar76 & 1) *
                                                                 auVar23._0_4_)))),auVar121);
      auVar115 = vsubps_avx(auVar114,auVar122);
      auVar217 = ZEXT3264(auVar115);
      auVar104 = vsubps_avx(auVar113,auVar123);
      auVar105 = vsubps_avx(auVar121,auVar124);
      auVar107._4_4_ = auVar116._4_4_ * fVar142;
      auVar107._0_4_ = auVar116._0_4_ * fVar89;
      auVar107._8_4_ = auVar116._8_4_ * fVar144;
      auVar107._12_4_ = auVar116._12_4_ * fVar146;
      auVar107._16_4_ = auVar116._16_4_ * 0.0;
      auVar107._20_4_ = auVar116._20_4_ * 0.0;
      auVar107._24_4_ = auVar116._24_4_ * 0.0;
      auVar107._28_4_ = 0;
      auVar97 = vfmsub231ps_fma(auVar107,auVar121,auVar106);
      auVar191._0_4_ = fVar90 * auVar106._0_4_;
      auVar191._4_4_ = fVar143 * auVar106._4_4_;
      auVar191._8_4_ = fVar145 * auVar106._8_4_;
      auVar191._12_4_ = fVar147 * auVar106._12_4_;
      auVar191._16_4_ = auVar106._16_4_ * 0.0;
      auVar191._20_4_ = auVar106._20_4_ * 0.0;
      auVar191._24_4_ = auVar106._24_4_ * 0.0;
      auVar191._28_4_ = 0;
      auVar91 = vfmsub231ps_fma(auVar191,auVar114,auVar117);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar112,ZEXT1632(auVar97));
      auVar201._0_4_ = auVar117._0_4_ * auVar121._0_4_;
      auVar201._4_4_ = auVar117._4_4_ * auVar121._4_4_;
      auVar201._8_4_ = auVar117._8_4_ * auVar121._8_4_;
      auVar201._12_4_ = auVar117._12_4_ * auVar121._12_4_;
      auVar201._16_4_ = auVar117._16_4_ * fVar219;
      auVar201._20_4_ = auVar117._20_4_ * fVar221;
      auVar201._24_4_ = auVar117._24_4_ * fVar167;
      auVar201._28_4_ = 0;
      auVar97 = vfmsub231ps_fma(auVar201,auVar113,auVar116);
      auVar107 = vfmadd231ps_avx512vl(auVar103,auVar112,ZEXT1632(auVar97));
      auVar103 = vmulps_avx512vl(auVar105,auVar122);
      auVar103 = vfmsub231ps_avx512vl(auVar103,auVar115,auVar124);
      auVar111._4_4_ = auVar104._4_4_ * auVar124._4_4_;
      auVar111._0_4_ = auVar104._0_4_ * auVar124._0_4_;
      auVar111._8_4_ = auVar104._8_4_ * auVar124._8_4_;
      auVar111._12_4_ = auVar104._12_4_ * auVar124._12_4_;
      auVar111._16_4_ = auVar104._16_4_ * fVar197;
      auVar111._20_4_ = auVar104._20_4_ * fVar196;
      auVar111._24_4_ = auVar104._24_4_ * fVar198;
      auVar111._28_4_ = iVar2;
      auVar97 = vfmsub231ps_fma(auVar111,auVar123,auVar105);
      auVar202._0_4_ = auVar123._0_4_ * auVar115._0_4_;
      auVar202._4_4_ = auVar123._4_4_ * auVar115._4_4_;
      auVar202._8_4_ = auVar123._8_4_ * auVar115._8_4_;
      auVar202._12_4_ = auVar123._12_4_ * auVar115._12_4_;
      auVar202._16_4_ = fVar180 * auVar115._16_4_;
      auVar202._20_4_ = fVar179 * auVar115._20_4_;
      auVar202._24_4_ = fVar195 * auVar115._24_4_;
      auVar202._28_4_ = 0;
      auVar91 = vfmsub231ps_fma(auVar202,auVar104,auVar122);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar112,auVar103);
      auVar111 = vfmadd231ps_avx512vl(auVar103,auVar112,ZEXT1632(auVar97));
      auVar205 = ZEXT3264(auVar111);
      auVar103 = vmaxps_avx(auVar107,auVar111);
      uVar27 = vcmpps_avx512vl(auVar103,auVar112,2);
      bVar87 = bVar87 & (byte)uVar27;
      if (bVar87 != 0) {
        auVar38._4_4_ = auVar105._4_4_ * auVar117._4_4_;
        auVar38._0_4_ = auVar105._0_4_ * auVar117._0_4_;
        auVar38._8_4_ = auVar105._8_4_ * auVar117._8_4_;
        auVar38._12_4_ = auVar105._12_4_ * auVar117._12_4_;
        auVar38._16_4_ = auVar105._16_4_ * auVar117._16_4_;
        auVar38._20_4_ = auVar105._20_4_ * auVar117._20_4_;
        auVar38._24_4_ = auVar105._24_4_ * auVar117._24_4_;
        auVar38._28_4_ = auVar103._28_4_;
        auVar23 = vfmsub231ps_fma(auVar38,auVar104,auVar116);
        auVar39._4_4_ = auVar116._4_4_ * auVar115._4_4_;
        auVar39._0_4_ = auVar116._0_4_ * auVar115._0_4_;
        auVar39._8_4_ = auVar116._8_4_ * auVar115._8_4_;
        auVar39._12_4_ = auVar116._12_4_ * auVar115._12_4_;
        auVar39._16_4_ = auVar116._16_4_ * auVar115._16_4_;
        auVar39._20_4_ = auVar116._20_4_ * auVar115._20_4_;
        auVar39._24_4_ = auVar116._24_4_ * auVar115._24_4_;
        auVar39._28_4_ = auVar116._28_4_;
        auVar99 = vfmsub231ps_fma(auVar39,auVar106,auVar105);
        auVar40._4_4_ = auVar104._4_4_ * auVar106._4_4_;
        auVar40._0_4_ = auVar104._0_4_ * auVar106._0_4_;
        auVar40._8_4_ = auVar104._8_4_ * auVar106._8_4_;
        auVar40._12_4_ = auVar104._12_4_ * auVar106._12_4_;
        auVar40._16_4_ = auVar104._16_4_ * auVar106._16_4_;
        auVar40._20_4_ = auVar104._20_4_ * auVar106._20_4_;
        auVar40._24_4_ = auVar104._24_4_ * auVar106._24_4_;
        auVar40._28_4_ = auVar104._28_4_;
        auVar24 = vfmsub231ps_fma(auVar40,auVar115,auVar117);
        auVar97 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar24));
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT1632(auVar23),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar91));
        auVar32._8_4_ = 0x3f800000;
        auVar32._0_8_ = 0x3f8000003f800000;
        auVar32._12_4_ = 0x3f800000;
        auVar32._16_4_ = 0x3f800000;
        auVar32._20_4_ = 0x3f800000;
        auVar32._24_4_ = 0x3f800000;
        auVar32._28_4_ = 0x3f800000;
        auVar117 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar91),auVar32);
        auVar97 = vfmadd132ps_fma(auVar117,auVar103,auVar103);
        auVar211 = ZEXT1664(auVar97);
        auVar41._4_4_ = auVar24._4_4_ * auVar121._4_4_;
        auVar41._0_4_ = auVar24._0_4_ * auVar121._0_4_;
        auVar41._8_4_ = auVar24._8_4_ * auVar121._8_4_;
        auVar41._12_4_ = auVar24._12_4_ * auVar121._12_4_;
        auVar41._16_4_ = fVar219 * 0.0;
        auVar41._20_4_ = fVar221 * 0.0;
        auVar41._24_4_ = fVar167 * 0.0;
        auVar41._28_4_ = iVar1;
        auVar99 = vfmadd231ps_fma(auVar41,auVar113,ZEXT1632(auVar99));
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar114,ZEXT1632(auVar23));
        fVar219 = auVar97._0_4_;
        fVar221 = auVar97._4_4_;
        fVar167 = auVar97._8_4_;
        fVar180 = auVar97._12_4_;
        local_5a0._28_4_ = auVar103._28_4_;
        local_5a0._0_28_ =
             ZEXT1628(CONCAT412(auVar99._12_4_ * fVar180,
                                CONCAT48(auVar99._8_4_ * fVar167,
                                         CONCAT44(auVar99._4_4_ * fVar221,auVar99._0_4_ * fVar219)))
                     );
        auVar217 = ZEXT3264(local_5a0);
        auVar154._4_4_ = local_760;
        auVar154._0_4_ = local_760;
        auVar154._8_4_ = local_760;
        auVar154._12_4_ = local_760;
        auVar154._16_4_ = local_760;
        auVar154._20_4_ = local_760;
        auVar154._24_4_ = local_760;
        auVar154._28_4_ = local_760;
        uVar27 = vcmpps_avx512vl(auVar154,local_5a0,2);
        uVar166 = *(undefined4 *)(ray + sVar86 * 4 + 0x200);
        auVar33._4_4_ = uVar166;
        auVar33._0_4_ = uVar166;
        auVar33._8_4_ = uVar166;
        auVar33._12_4_ = uVar166;
        auVar33._16_4_ = uVar166;
        auVar33._20_4_ = uVar166;
        auVar33._24_4_ = uVar166;
        auVar33._28_4_ = uVar166;
        uVar29 = vcmpps_avx512vl(local_5a0,auVar33,2);
        bVar87 = (byte)uVar27 & (byte)uVar29 & bVar87;
        if (bVar87 != 0) {
          uVar88 = vcmpps_avx512vl(ZEXT1632(auVar91),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar88 = bVar87 & uVar88;
          if ((char)uVar88 != '\0') {
            fVar179 = auVar107._0_4_ * fVar219;
            fVar195 = auVar107._4_4_ * fVar221;
            auVar42._4_4_ = fVar195;
            auVar42._0_4_ = fVar179;
            fVar196 = auVar107._8_4_ * fVar167;
            auVar42._8_4_ = fVar196;
            fVar197 = auVar107._12_4_ * fVar180;
            auVar42._12_4_ = fVar197;
            fVar198 = auVar107._16_4_ * 0.0;
            auVar42._16_4_ = fVar198;
            fVar89 = auVar107._20_4_ * 0.0;
            auVar42._20_4_ = fVar89;
            fVar90 = auVar107._24_4_ * 0.0;
            auVar42._24_4_ = fVar90;
            auVar42._28_4_ = auVar107._28_4_;
            auVar155._8_4_ = 0x3f800000;
            auVar155._0_8_ = 0x3f8000003f800000;
            auVar155._12_4_ = 0x3f800000;
            auVar155._16_4_ = 0x3f800000;
            auVar155._20_4_ = 0x3f800000;
            auVar155._24_4_ = 0x3f800000;
            auVar155._28_4_ = 0x3f800000;
            auVar103 = vsubps_avx(auVar155,auVar42);
            local_5e0._0_4_ =
                 (float)((uint)(bVar76 & 1) * (int)fVar179 |
                        (uint)!(bool)(bVar76 & 1) * auVar103._0_4_);
            bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar9 * (int)fVar195 | (uint)!bVar9 * auVar103._4_4_);
            bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar9 * (int)fVar196 | (uint)!bVar9 * auVar103._8_4_);
            bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar9 * (int)fVar197 | (uint)!bVar9 * auVar103._12_4_);
            bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
            local_5e0._16_4_ = (float)((uint)bVar9 * (int)fVar198 | (uint)!bVar9 * auVar103._16_4_);
            bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
            local_5e0._20_4_ = (float)((uint)bVar9 * (int)fVar89 | (uint)!bVar9 * auVar103._20_4_);
            bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
            local_5e0._24_4_ = (float)((uint)bVar9 * (int)fVar90 | (uint)!bVar9 * auVar103._24_4_);
            bVar9 = SUB81(uVar77 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar9 * auVar107._28_4_ | (uint)!bVar9 * auVar103._28_4_);
            auVar103 = vsubps_avx(auVar110,auVar109);
            auVar97 = vfmadd213ps_fma(auVar103,local_5e0,auVar109);
            uVar166 = *(undefined4 *)((long)local_7f8->ray_space + sVar86 * 4 + -0x40);
            auVar109._4_4_ = uVar166;
            auVar109._0_4_ = uVar166;
            auVar109._8_4_ = uVar166;
            auVar109._12_4_ = uVar166;
            auVar109._16_4_ = uVar166;
            auVar109._20_4_ = uVar166;
            auVar109._24_4_ = uVar166;
            auVar109._28_4_ = uVar166;
            auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar97._12_4_ + auVar97._12_4_,
                                                          CONCAT48(auVar97._8_4_ + auVar97._8_4_,
                                                                   CONCAT44(auVar97._4_4_ +
                                                                            auVar97._4_4_,
                                                                            auVar97._0_4_ +
                                                                            auVar97._0_4_)))),
                                       auVar109);
            uVar28 = vcmpps_avx512vl(local_5a0,auVar103,6);
            uVar88 = uVar88 & uVar28;
            bVar87 = (byte)uVar88;
            if (bVar87 != 0) {
              auVar177._0_4_ = auVar111._0_4_ * fVar219;
              auVar177._4_4_ = auVar111._4_4_ * fVar221;
              auVar177._8_4_ = auVar111._8_4_ * fVar167;
              auVar177._12_4_ = auVar111._12_4_ * fVar180;
              auVar177._16_4_ = auVar111._16_4_ * 0.0;
              auVar177._20_4_ = auVar111._20_4_ * 0.0;
              auVar177._24_4_ = auVar111._24_4_ * 0.0;
              auVar177._28_4_ = 0;
              auVar192._8_4_ = 0x3f800000;
              auVar192._0_8_ = 0x3f8000003f800000;
              auVar192._12_4_ = 0x3f800000;
              auVar192._16_4_ = 0x3f800000;
              auVar192._20_4_ = 0x3f800000;
              auVar192._24_4_ = 0x3f800000;
              auVar192._28_4_ = 0x3f800000;
              auVar103 = vsubps_avx(auVar192,auVar177);
              auVar126._0_4_ =
                   (uint)(bVar76 & 1) * (int)auVar177._0_4_ |
                   (uint)!(bool)(bVar76 & 1) * auVar103._0_4_;
              bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar126._4_4_ = (uint)bVar9 * (int)auVar177._4_4_ | (uint)!bVar9 * auVar103._4_4_;
              bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar126._8_4_ = (uint)bVar9 * (int)auVar177._8_4_ | (uint)!bVar9 * auVar103._8_4_;
              bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar126._12_4_ = (uint)bVar9 * (int)auVar177._12_4_ | (uint)!bVar9 * auVar103._12_4_;
              bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar126._16_4_ = (uint)bVar9 * (int)auVar177._16_4_ | (uint)!bVar9 * auVar103._16_4_;
              bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar126._20_4_ = (uint)bVar9 * (int)auVar177._20_4_ | (uint)!bVar9 * auVar103._20_4_;
              bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar126._24_4_ = (uint)bVar9 * (int)auVar177._24_4_ | (uint)!bVar9 * auVar103._24_4_;
              auVar126._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar103._28_4_;
              auVar110._8_4_ = 0x40000000;
              auVar110._0_8_ = 0x4000000040000000;
              auVar110._12_4_ = 0x40000000;
              auVar110._16_4_ = 0x40000000;
              auVar110._20_4_ = 0x40000000;
              auVar110._24_4_ = 0x40000000;
              auVar110._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar126,auVar192,auVar110);
              local_580 = 0;
              local_570 = local_860;
              uStack_568 = uStack_858;
              local_560 = local_880;
              uStack_558 = uStack_878;
              local_550 = local_890;
              uStack_548 = uStack_888;
              local_540 = local_870;
              uStack_538 = uStack_868;
              if ((pGVar82->mask & *(uint *)(ray + sVar86 * 4 + 0x240)) != 0) {
                fVar170 = 1.0 / auVar108._0_4_;
                local_520[0] = fVar170 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar170 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar170 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar170 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar170 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar170 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar170 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                auVar156._8_4_ = 0x7f800000;
                auVar156._0_8_ = 0x7f8000007f800000;
                auVar156._12_4_ = 0x7f800000;
                auVar156._16_4_ = 0x7f800000;
                auVar156._20_4_ = 0x7f800000;
                auVar156._24_4_ = 0x7f800000;
                auVar156._28_4_ = 0x7f800000;
                auVar103 = vblendmps_avx512vl(auVar156,local_5a0);
                auVar127._0_4_ =
                     (uint)(bVar87 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                bVar9 = (bool)((byte)(uVar88 >> 1) & 1);
                auVar127._4_4_ = (uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar88 >> 2) & 1);
                auVar127._8_4_ = (uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar88 >> 3) & 1);
                auVar127._12_4_ = (uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar88 >> 4) & 1);
                auVar127._16_4_ = (uint)bVar9 * auVar103._16_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar88 >> 5) & 1);
                auVar127._20_4_ = (uint)bVar9 * auVar103._20_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)((byte)(uVar88 >> 6) & 1);
                auVar127._24_4_ = (uint)bVar9 * auVar103._24_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = SUB81(uVar88 >> 7,0);
                auVar127._28_4_ = (uint)bVar9 * auVar103._28_4_ | (uint)!bVar9 * 0x7f800000;
                auVar103 = vshufps_avx(auVar127,auVar127,0xb1);
                auVar103 = vminps_avx(auVar127,auVar103);
                auVar117 = vshufpd_avx(auVar103,auVar103,5);
                auVar103 = vminps_avx(auVar103,auVar117);
                auVar117 = vpermpd_avx2(auVar103,0x4e);
                auVar103 = vminps_avx(auVar103,auVar117);
                uVar27 = vcmpps_avx512vl(auVar127,auVar103,0);
                uVar79 = (uint)uVar88;
                if ((bVar87 & (byte)uVar27) != 0) {
                  uVar79 = (uint)(bVar87 & (byte)uVar27);
                }
                uVar30 = 0;
                for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                  uVar30 = uVar30 + 1;
                }
                uVar77 = (ulong)uVar30;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar82->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780 = *(float *)(ray + sVar86 * 4 + 0x200);
                  fStack_77c = 0.0;
                  fStack_778 = 0.0;
                  fStack_774 = 0.0;
                  local_7e0 = local_5a0;
                  local_57c = iVar6;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar77]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar77 * 4)));
                    *(undefined4 *)(ray + sVar86 * 4 + 0x200) =
                         *(undefined4 *)(local_4e0 + uVar77 * 4);
                    local_850.context = context->user;
                    fVar167 = local_200._0_4_;
                    fVar219 = 1.0 - fVar167;
                    fVar170 = fVar219 * fVar219 * -3.0;
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219)),
                                              ZEXT416((uint)(fVar167 * fVar219)),ZEXT416(0xc0000000)
                                             );
                    auVar91 = vfmsub132ss_fma(ZEXT416((uint)(fVar167 * fVar219)),
                                              ZEXT416((uint)(fVar167 * fVar167)),ZEXT416(0x40000000)
                                             );
                    fVar219 = auVar97._0_4_ * 3.0;
                    fVar221 = auVar91._0_4_ * 3.0;
                    fVar167 = fVar167 * fVar167 * 3.0;
                    auVar210._0_4_ = fVar167 * fVar163;
                    auVar210._4_4_ = fVar167 * fVar164;
                    auVar210._8_4_ = fVar167 * fVar165;
                    auVar210._12_4_ = fVar167 * fVar75;
                    auVar152._4_4_ = fVar221;
                    auVar152._0_4_ = fVar221;
                    auVar152._8_4_ = fVar221;
                    auVar152._12_4_ = fVar221;
                    auVar97 = vfmadd132ps_fma(auVar152,auVar210,auVar92);
                    auVar190._4_4_ = fVar219;
                    auVar190._0_4_ = fVar219;
                    auVar190._8_4_ = fVar219;
                    auVar190._12_4_ = fVar219;
                    auVar97 = vfmadd132ps_fma(auVar190,auVar97,auVar148);
                    auVar153._4_4_ = fVar170;
                    auVar153._0_4_ = fVar170;
                    auVar153._8_4_ = fVar170;
                    auVar153._12_4_ = fVar170;
                    auVar97 = vfmadd132ps_fma(auVar153,auVar97,auVar98);
                    auVar141 = vbroadcastss_avx512f(auVar97);
                    auVar205 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar205 = vpermps_avx512f(auVar205,ZEXT1664(auVar97));
                    auVar211 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar211,ZEXT1664(auVar97));
                    local_2c0[0] = (RTCHitN)auVar141[0];
                    local_2c0[1] = (RTCHitN)auVar141[1];
                    local_2c0[2] = (RTCHitN)auVar141[2];
                    local_2c0[3] = (RTCHitN)auVar141[3];
                    local_2c0[4] = (RTCHitN)auVar141[4];
                    local_2c0[5] = (RTCHitN)auVar141[5];
                    local_2c0[6] = (RTCHitN)auVar141[6];
                    local_2c0[7] = (RTCHitN)auVar141[7];
                    local_2c0[8] = (RTCHitN)auVar141[8];
                    local_2c0[9] = (RTCHitN)auVar141[9];
                    local_2c0[10] = (RTCHitN)auVar141[10];
                    local_2c0[0xb] = (RTCHitN)auVar141[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar141[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar141[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar141[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar141[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar141[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar141[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar141[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar141[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar141[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar141[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar141[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar141[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar141[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar141[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar141[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar141[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar141[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar141[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar141[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar141[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar141[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar141[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar141[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar141[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar141[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar141[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar141[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar141[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar141[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar141[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar141[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar141[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar141[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar141[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar141[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar141[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar141[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar141[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar141[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar141[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar141[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar141[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar141[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar141[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar141[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar141[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar141[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar141[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar141[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar141[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar141[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar141[0x3f];
                    local_280 = auVar205;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar141 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar141);
                    auVar103 = vpcmpeqd_avx2(auVar141._0_32_,auVar141._0_32_);
                    local_800[3] = auVar103;
                    local_800[2] = auVar103;
                    local_800[1] = auVar103;
                    *local_800 = auVar103;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instPrimID[0]));
                    auVar141 = vmovdqa64_avx512f(local_380);
                    local_740 = vmovdqa64_avx512f(auVar141);
                    local_850.valid = (int *)local_740;
                    local_850.geometryUserPtr = pGVar82->userPtr;
                    local_850.hit = local_2c0;
                    local_850.N = 0x10;
                    local_850.ray = (RTCRayN *)ray;
                    if (pGVar82->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar205 = ZEXT1664(auVar205._0_16_);
                      auVar211 = ZEXT1664(auVar211._0_16_);
                      (*pGVar82->intersectionFilterN)(&local_850);
                      auVar217 = ZEXT3264(local_7e0);
                      auVar233 = ZEXT3264(local_7a0);
                      auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar234 = ZEXT3264(auVar103);
                      auVar103 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar162 = ZEXT3264(auVar103);
                      auVar141 = vmovdqa64_avx512f(local_740);
                      sVar86 = local_808;
                    }
                    uVar27 = vptestmd_avx512f(auVar141,auVar141);
                    if ((short)uVar27 == 0) {
LAB_017d5e26:
                      *(float *)(ray + sVar86 * 4 + 0x200) = local_780;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar82->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar205 = ZEXT1664(auVar205._0_16_);
                        auVar211 = ZEXT1664(auVar211._0_16_);
                        (*p_Var8)(&local_850);
                        auVar217 = ZEXT3264(local_7e0);
                        auVar233 = ZEXT3264(local_7a0);
                        auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar234 = ZEXT3264(auVar103);
                        auVar103 = vbroadcastss_avx512vl(ZEXT416(1));
                        auVar162 = ZEXT3264(auVar103);
                        auVar141 = vmovdqa64_avx512f(local_740);
                        sVar86 = local_808;
                      }
                      uVar28 = vptestmd_avx512f(auVar141,auVar141);
                      if ((short)uVar28 == 0) goto LAB_017d5e26;
                      iVar1 = *(int *)(local_850.hit + 4);
                      iVar2 = *(int *)(local_850.hit + 8);
                      iVar60 = *(int *)(local_850.hit + 0xc);
                      iVar61 = *(int *)(local_850.hit + 0x10);
                      iVar62 = *(int *)(local_850.hit + 0x14);
                      iVar63 = *(int *)(local_850.hit + 0x18);
                      iVar64 = *(int *)(local_850.hit + 0x1c);
                      iVar65 = *(int *)(local_850.hit + 0x20);
                      iVar66 = *(int *)(local_850.hit + 0x24);
                      iVar67 = *(int *)(local_850.hit + 0x28);
                      iVar68 = *(int *)(local_850.hit + 0x2c);
                      iVar69 = *(int *)(local_850.hit + 0x30);
                      iVar70 = *(int *)(local_850.hit + 0x34);
                      iVar71 = *(int *)(local_850.hit + 0x38);
                      iVar72 = *(int *)(local_850.hit + 0x3c);
                      bVar87 = (byte)uVar28;
                      bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar76 = (byte)(uVar28 >> 8);
                      bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar22 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x300) =
                           (uint)(bVar87 & 1) * *(int *)local_850.hit |
                           (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x300);
                      *(uint *)(local_850.ray + 0x304) =
                           (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 0x304);
                      *(uint *)(local_850.ray + 0x308) =
                           (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(local_850.ray + 0x308);
                      *(uint *)(local_850.ray + 0x30c) =
                           (uint)bVar11 * iVar60 | (uint)!bVar11 * *(int *)(local_850.ray + 0x30c);
                      *(uint *)(local_850.ray + 0x310) =
                           (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_850.ray + 0x310);
                      *(uint *)(local_850.ray + 0x314) =
                           (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_850.ray + 0x314);
                      *(uint *)(local_850.ray + 0x318) =
                           (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_850.ray + 0x318);
                      *(uint *)(local_850.ray + 0x31c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_850.ray + 0x31c);
                      *(uint *)(local_850.ray + 800) =
                           (uint)(bVar76 & 1) * iVar65 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 800);
                      *(uint *)(local_850.ray + 0x324) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_850.ray + 0x324);
                      *(uint *)(local_850.ray + 0x328) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_850.ray + 0x328);
                      *(uint *)(local_850.ray + 0x32c) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_850.ray + 0x32c);
                      *(uint *)(local_850.ray + 0x330) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_850.ray + 0x330);
                      *(uint *)(local_850.ray + 0x334) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_850.ray + 0x334);
                      *(uint *)(local_850.ray + 0x338) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_850.ray + 0x338);
                      *(uint *)(local_850.ray + 0x33c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_850.ray + 0x33c);
                      iVar1 = *(int *)(local_850.hit + 0x44);
                      iVar2 = *(int *)(local_850.hit + 0x48);
                      iVar60 = *(int *)(local_850.hit + 0x4c);
                      iVar61 = *(int *)(local_850.hit + 0x50);
                      iVar62 = *(int *)(local_850.hit + 0x54);
                      iVar63 = *(int *)(local_850.hit + 0x58);
                      iVar64 = *(int *)(local_850.hit + 0x5c);
                      iVar65 = *(int *)(local_850.hit + 0x60);
                      iVar66 = *(int *)(local_850.hit + 100);
                      iVar67 = *(int *)(local_850.hit + 0x68);
                      iVar68 = *(int *)(local_850.hit + 0x6c);
                      iVar69 = *(int *)(local_850.hit + 0x70);
                      iVar70 = *(int *)(local_850.hit + 0x74);
                      iVar71 = *(int *)(local_850.hit + 0x78);
                      iVar72 = *(int *)(local_850.hit + 0x7c);
                      bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar22 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x340) =
                           (uint)(bVar87 & 1) * *(int *)(local_850.hit + 0x40) |
                           (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x340);
                      *(uint *)(local_850.ray + 0x344) =
                           (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 0x344);
                      *(uint *)(local_850.ray + 0x348) =
                           (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(local_850.ray + 0x348);
                      *(uint *)(local_850.ray + 0x34c) =
                           (uint)bVar11 * iVar60 | (uint)!bVar11 * *(int *)(local_850.ray + 0x34c);
                      *(uint *)(local_850.ray + 0x350) =
                           (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_850.ray + 0x350);
                      *(uint *)(local_850.ray + 0x354) =
                           (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_850.ray + 0x354);
                      *(uint *)(local_850.ray + 0x358) =
                           (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_850.ray + 0x358);
                      *(uint *)(local_850.ray + 0x35c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_850.ray + 0x35c);
                      *(uint *)(local_850.ray + 0x360) =
                           (uint)(bVar76 & 1) * iVar65 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 0x360);
                      *(uint *)(local_850.ray + 0x364) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_850.ray + 0x364);
                      *(uint *)(local_850.ray + 0x368) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_850.ray + 0x368);
                      *(uint *)(local_850.ray + 0x36c) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_850.ray + 0x36c);
                      *(uint *)(local_850.ray + 0x370) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_850.ray + 0x370);
                      *(uint *)(local_850.ray + 0x374) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_850.ray + 0x374);
                      *(uint *)(local_850.ray + 0x378) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_850.ray + 0x378);
                      *(uint *)(local_850.ray + 0x37c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_850.ray + 0x37c);
                      iVar1 = *(int *)(local_850.hit + 0x84);
                      iVar2 = *(int *)(local_850.hit + 0x88);
                      iVar60 = *(int *)(local_850.hit + 0x8c);
                      iVar61 = *(int *)(local_850.hit + 0x90);
                      iVar62 = *(int *)(local_850.hit + 0x94);
                      iVar63 = *(int *)(local_850.hit + 0x98);
                      iVar64 = *(int *)(local_850.hit + 0x9c);
                      iVar65 = *(int *)(local_850.hit + 0xa0);
                      iVar66 = *(int *)(local_850.hit + 0xa4);
                      iVar67 = *(int *)(local_850.hit + 0xa8);
                      iVar68 = *(int *)(local_850.hit + 0xac);
                      iVar69 = *(int *)(local_850.hit + 0xb0);
                      iVar70 = *(int *)(local_850.hit + 0xb4);
                      iVar71 = *(int *)(local_850.hit + 0xb8);
                      iVar72 = *(int *)(local_850.hit + 0xbc);
                      bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar22 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x380) =
                           (uint)(bVar87 & 1) * *(int *)(local_850.hit + 0x80) |
                           (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x380);
                      *(uint *)(local_850.ray + 900) =
                           (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 900);
                      *(uint *)(local_850.ray + 0x388) =
                           (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(local_850.ray + 0x388);
                      *(uint *)(local_850.ray + 0x38c) =
                           (uint)bVar11 * iVar60 | (uint)!bVar11 * *(int *)(local_850.ray + 0x38c);
                      *(uint *)(local_850.ray + 0x390) =
                           (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_850.ray + 0x390);
                      *(uint *)(local_850.ray + 0x394) =
                           (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_850.ray + 0x394);
                      *(uint *)(local_850.ray + 0x398) =
                           (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_850.ray + 0x398);
                      *(uint *)(local_850.ray + 0x39c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_850.ray + 0x39c);
                      *(uint *)(local_850.ray + 0x3a0) =
                           (uint)(bVar76 & 1) * iVar65 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 0x3a0);
                      *(uint *)(local_850.ray + 0x3a4) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_850.ray + 0x3a4);
                      *(uint *)(local_850.ray + 0x3a8) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_850.ray + 0x3a8);
                      *(uint *)(local_850.ray + 0x3ac) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_850.ray + 0x3ac);
                      *(uint *)(local_850.ray + 0x3b0) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_850.ray + 0x3b0);
                      *(uint *)(local_850.ray + 0x3b4) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_850.ray + 0x3b4);
                      *(uint *)(local_850.ray + 0x3b8) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_850.ray + 0x3b8);
                      *(uint *)(local_850.ray + 0x3bc) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_850.ray + 0x3bc);
                      iVar1 = *(int *)(local_850.hit + 0xc4);
                      iVar2 = *(int *)(local_850.hit + 200);
                      iVar60 = *(int *)(local_850.hit + 0xcc);
                      iVar61 = *(int *)(local_850.hit + 0xd0);
                      iVar62 = *(int *)(local_850.hit + 0xd4);
                      iVar63 = *(int *)(local_850.hit + 0xd8);
                      iVar64 = *(int *)(local_850.hit + 0xdc);
                      iVar65 = *(int *)(local_850.hit + 0xe0);
                      iVar66 = *(int *)(local_850.hit + 0xe4);
                      iVar67 = *(int *)(local_850.hit + 0xe8);
                      iVar68 = *(int *)(local_850.hit + 0xec);
                      iVar69 = *(int *)(local_850.hit + 0xf0);
                      iVar70 = *(int *)(local_850.hit + 0xf4);
                      iVar71 = *(int *)(local_850.hit + 0xf8);
                      iVar72 = *(int *)(local_850.hit + 0xfc);
                      bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar22 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x3c0) =
                           (uint)(bVar87 & 1) * *(int *)(local_850.hit + 0xc0) |
                           (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x3c0);
                      *(uint *)(local_850.ray + 0x3c4) =
                           (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 0x3c4);
                      *(uint *)(local_850.ray + 0x3c8) =
                           (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(local_850.ray + 0x3c8);
                      *(uint *)(local_850.ray + 0x3cc) =
                           (uint)bVar11 * iVar60 | (uint)!bVar11 * *(int *)(local_850.ray + 0x3cc);
                      *(uint *)(local_850.ray + 0x3d0) =
                           (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_850.ray + 0x3d0);
                      *(uint *)(local_850.ray + 0x3d4) =
                           (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_850.ray + 0x3d4);
                      *(uint *)(local_850.ray + 0x3d8) =
                           (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_850.ray + 0x3d8);
                      *(uint *)(local_850.ray + 0x3dc) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_850.ray + 0x3dc);
                      *(uint *)(local_850.ray + 0x3e0) =
                           (uint)(bVar76 & 1) * iVar65 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 0x3e0);
                      *(uint *)(local_850.ray + 0x3e4) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_850.ray + 0x3e4);
                      *(uint *)(local_850.ray + 1000) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_850.ray + 1000);
                      *(uint *)(local_850.ray + 0x3ec) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_850.ray + 0x3ec);
                      *(uint *)(local_850.ray + 0x3f0) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_850.ray + 0x3f0);
                      *(uint *)(local_850.ray + 0x3f4) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_850.ray + 0x3f4);
                      *(uint *)(local_850.ray + 0x3f8) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_850.ray + 0x3f8);
                      *(uint *)(local_850.ray + 0x3fc) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_850.ray + 0x3fc);
                      iVar1 = *(int *)(local_850.hit + 0x104);
                      iVar2 = *(int *)(local_850.hit + 0x108);
                      iVar60 = *(int *)(local_850.hit + 0x10c);
                      iVar61 = *(int *)(local_850.hit + 0x110);
                      iVar62 = *(int *)(local_850.hit + 0x114);
                      iVar63 = *(int *)(local_850.hit + 0x118);
                      iVar64 = *(int *)(local_850.hit + 0x11c);
                      iVar65 = *(int *)(local_850.hit + 0x120);
                      iVar66 = *(int *)(local_850.hit + 0x124);
                      iVar67 = *(int *)(local_850.hit + 0x128);
                      iVar68 = *(int *)(local_850.hit + 300);
                      iVar69 = *(int *)(local_850.hit + 0x130);
                      iVar70 = *(int *)(local_850.hit + 0x134);
                      iVar71 = *(int *)(local_850.hit + 0x138);
                      iVar72 = *(int *)(local_850.hit + 0x13c);
                      bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar22 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_850.ray + 0x400) =
                           (uint)(bVar87 & 1) * *(int *)(local_850.hit + 0x100) |
                           (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x400);
                      *(uint *)(local_850.ray + 0x404) =
                           (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 0x404);
                      *(uint *)(local_850.ray + 0x408) =
                           (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(local_850.ray + 0x408);
                      *(uint *)(local_850.ray + 0x40c) =
                           (uint)bVar11 * iVar60 | (uint)!bVar11 * *(int *)(local_850.ray + 0x40c);
                      *(uint *)(local_850.ray + 0x410) =
                           (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_850.ray + 0x410);
                      *(uint *)(local_850.ray + 0x414) =
                           (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_850.ray + 0x414);
                      *(uint *)(local_850.ray + 0x418) =
                           (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_850.ray + 0x418);
                      *(uint *)(local_850.ray + 0x41c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_850.ray + 0x41c);
                      *(uint *)(local_850.ray + 0x420) =
                           (uint)(bVar76 & 1) * iVar65 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 0x420);
                      *(uint *)(local_850.ray + 0x424) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_850.ray + 0x424);
                      *(uint *)(local_850.ray + 0x428) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_850.ray + 0x428);
                      *(uint *)(local_850.ray + 0x42c) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_850.ray + 0x42c);
                      *(uint *)(local_850.ray + 0x430) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_850.ray + 0x430);
                      *(uint *)(local_850.ray + 0x434) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_850.ray + 0x434);
                      *(uint *)(local_850.ray + 0x438) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_850.ray + 0x438);
                      *(uint *)(local_850.ray + 0x43c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_850.ray + 0x43c);
                      auVar141 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x140));
                      auVar141 = vmovdqu32_avx512f(auVar141);
                      *(undefined1 (*) [64])(local_850.ray + 0x440) = auVar141;
                      auVar141 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x180));
                      auVar141 = vmovdqu32_avx512f(auVar141);
                      *(undefined1 (*) [64])(local_850.ray + 0x480) = auVar141;
                      auVar141 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x1c0));
                      auVar141 = vmovdqa32_avx512f(auVar141);
                      *(undefined1 (*) [64])(local_850.ray + 0x4c0) = auVar141;
                      auVar141 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x200));
                      auVar141 = vmovdqa32_avx512f(auVar141);
                      *(undefined1 (*) [64])(local_850.ray + 0x500) = auVar141;
                      local_780 = *(float *)(ray + sVar86 * 4 + 0x200);
                      fStack_77c = 0.0;
                      fStack_778 = 0.0;
                      fStack_774 = 0.0;
                    }
                    bVar87 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & (byte)uVar88;
                    auVar160._4_4_ = local_780;
                    auVar160._0_4_ = local_780;
                    auVar160._8_4_ = local_780;
                    auVar160._12_4_ = local_780;
                    auVar160._16_4_ = local_780;
                    auVar160._20_4_ = local_780;
                    auVar160._24_4_ = local_780;
                    auVar160._28_4_ = local_780;
                    uVar27 = vcmpps_avx512vl(auVar217._0_32_,auVar160,2);
                    if ((bVar87 & (byte)uVar27) == 0) goto LAB_017d4d6c;
                    bVar87 = bVar87 & (byte)uVar27;
                    uVar88 = (ulong)bVar87;
                    auVar161._8_4_ = 0x7f800000;
                    auVar161._0_8_ = 0x7f8000007f800000;
                    auVar161._12_4_ = 0x7f800000;
                    auVar161._16_4_ = 0x7f800000;
                    auVar161._20_4_ = 0x7f800000;
                    auVar161._24_4_ = 0x7f800000;
                    auVar161._28_4_ = 0x7f800000;
                    auVar103 = vblendmps_avx512vl(auVar161,auVar217._0_32_);
                    auVar140._0_4_ =
                         (uint)(bVar87 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                    bVar9 = (bool)(bVar87 >> 1 & 1);
                    auVar140._4_4_ = (uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)(bVar87 >> 2 & 1);
                    auVar140._8_4_ = (uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)(bVar87 >> 3 & 1);
                    auVar140._12_4_ = (uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)(bVar87 >> 4 & 1);
                    auVar140._16_4_ = (uint)bVar9 * auVar103._16_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)(bVar87 >> 5 & 1);
                    auVar140._20_4_ = (uint)bVar9 * auVar103._20_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)(bVar87 >> 6 & 1);
                    auVar140._24_4_ = (uint)bVar9 * auVar103._24_4_ | (uint)!bVar9 * 0x7f800000;
                    auVar140._28_4_ =
                         (uint)(bVar87 >> 7) * auVar103._28_4_ |
                         (uint)!(bool)(bVar87 >> 7) * 0x7f800000;
                    auVar103 = vshufps_avx(auVar140,auVar140,0xb1);
                    auVar103 = vminps_avx(auVar140,auVar103);
                    auVar117 = vshufpd_avx(auVar103,auVar103,5);
                    auVar103 = vminps_avx(auVar103,auVar117);
                    auVar117 = vpermpd_avx2(auVar103,0x4e);
                    auVar103 = vminps_avx(auVar103,auVar117);
                    uVar27 = vcmpps_avx512vl(auVar140,auVar103,0);
                    bVar76 = (byte)uVar27 & bVar87;
                    if (bVar76 != 0) {
                      bVar87 = bVar76;
                    }
                    uVar78 = 0;
                    for (uVar79 = (uint)bVar87; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000
                        ) {
                      uVar78 = uVar78 + 1;
                    }
                    uVar77 = (ulong)uVar78;
                  } while( true );
                }
                fVar170 = local_520[uVar77];
                uVar166 = *(undefined4 *)(local_500 + uVar77 * 4);
                fVar221 = 1.0 - fVar170;
                fVar219 = fVar221 * fVar221 * -3.0;
                auVar205 = ZEXT464((uint)fVar219);
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar221)),
                                          ZEXT416((uint)(fVar170 * fVar221)),ZEXT416(0xc0000000));
                auVar91 = vfmsub132ss_fma(ZEXT416((uint)(fVar170 * fVar221)),
                                          ZEXT416((uint)(fVar170 * fVar170)),ZEXT416(0x40000000));
                fVar221 = auVar97._0_4_ * 3.0;
                fVar167 = auVar91._0_4_ * 3.0;
                fVar180 = fVar170 * fVar170 * 3.0;
                auVar207._0_4_ = fVar180 * fVar163;
                auVar207._4_4_ = fVar180 * fVar164;
                auVar207._8_4_ = fVar180 * fVar165;
                auVar207._12_4_ = fVar180 * fVar75;
                auVar211 = ZEXT1664(auVar207);
                auVar173._4_4_ = fVar167;
                auVar173._0_4_ = fVar167;
                auVar173._8_4_ = fVar167;
                auVar173._12_4_ = fVar167;
                auVar97 = vfmadd132ps_fma(auVar173,auVar207,auVar92);
                auVar187._4_4_ = fVar221;
                auVar187._0_4_ = fVar221;
                auVar187._8_4_ = fVar221;
                auVar187._12_4_ = fVar221;
                auVar97 = vfmadd132ps_fma(auVar187,auVar97,auVar148);
                auVar174._4_4_ = fVar219;
                auVar174._0_4_ = fVar219;
                auVar174._8_4_ = fVar219;
                auVar174._12_4_ = fVar219;
                auVar97 = vfmadd132ps_fma(auVar174,auVar97,auVar98);
                *(undefined4 *)(ray + sVar86 * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar77 * 4);
                *(int *)(ray + sVar86 * 4 + 0x300) = auVar97._0_4_;
                uVar7 = vextractps_avx(auVar97,1);
                *(undefined4 *)(ray + sVar86 * 4 + 0x340) = uVar7;
                uVar7 = vextractps_avx(auVar97,2);
                *(undefined4 *)(ray + sVar86 * 4 + 0x380) = uVar7;
                *(float *)(ray + sVar86 * 4 + 0x3c0) = fVar170;
                *(undefined4 *)(ray + sVar86 * 4 + 0x400) = uVar166;
                *(uint *)(ray + sVar86 * 4 + 0x440) = uVar78;
                *(uint *)(ray + sVar86 * 4 + 0x480) = uVar5;
                *(uint *)(ray + sVar86 * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + sVar86 * 4 + 0x500) = context->user->instPrimID[0];
LAB_017d4d6c:
                fVar170 = (float)local_820._0_4_;
              }
            }
          }
        }
      }
    }
    local_820._0_4_ = fVar170;
    if (8 < iVar6) {
      auVar103 = vpbroadcastd_avx512vl();
      auVar141 = ZEXT3264(auVar103);
      local_780 = (float)local_820._0_4_;
      fStack_77c = (float)local_820._0_4_;
      fStack_778 = (float)local_820._0_4_;
      fStack_774 = (float)local_820._0_4_;
      fStack_770 = (float)local_820._0_4_;
      fStack_76c = (float)local_820._0_4_;
      fStack_768 = (float)local_820._0_4_;
      fStack_764 = (float)local_820._0_4_;
      uStack_75c = local_760;
      uStack_758 = local_760;
      uStack_754 = local_760;
      uStack_750 = local_760;
      uStack_74c = local_760;
      uStack_748 = local_760;
      uStack_744 = local_760;
      local_420 = 1.0 / (float)local_7c0._0_4_;
      fStack_41c = local_420;
      fStack_418 = local_420;
      fStack_414 = local_420;
      fStack_410 = local_420;
      fStack_40c = local_420;
      fStack_408 = local_420;
      fStack_404 = local_420;
      lVar83 = 8;
LAB_017d4df7:
      if (lVar83 < local_7e8) {
        auVar103 = vpbroadcastd_avx512vl();
        auVar103 = vpor_avx2(auVar103,_DAT_01fb4ba0);
        uVar29 = vpcmpgtd_avx512vl(auVar141._0_32_,auVar103);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 * 4 + lVar85);
        auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21fb768 + lVar83 * 4);
        auVar116 = *(undefined1 (*) [32])(lVar85 + 0x21fbbec + lVar83 * 4);
        auVar115 = *(undefined1 (*) [32])(lVar85 + 0x21fc070 + lVar83 * 4);
        auVar212._0_4_ = auVar115._0_4_ * (float)local_6c0._0_4_;
        auVar212._4_4_ = auVar115._4_4_ * (float)local_6c0._4_4_;
        auVar212._8_4_ = auVar115._8_4_ * fStack_6b8;
        auVar212._12_4_ = auVar115._12_4_ * fStack_6b4;
        auVar212._16_4_ = auVar115._16_4_ * fStack_6b0;
        auVar212._20_4_ = auVar115._20_4_ * fStack_6ac;
        auVar212._28_36_ = auVar211._28_36_;
        auVar212._24_4_ = auVar115._24_4_ * fStack_6a8;
        auVar211._0_4_ = auVar115._0_4_ * (float)local_6e0._0_4_;
        auVar211._4_4_ = auVar115._4_4_ * (float)local_6e0._4_4_;
        auVar211._8_4_ = auVar115._8_4_ * fStack_6d8;
        auVar211._12_4_ = auVar115._12_4_ * fStack_6d4;
        auVar211._16_4_ = auVar115._16_4_ * fStack_6d0;
        auVar211._20_4_ = auVar115._20_4_ * fStack_6cc;
        auVar211._28_36_ = auVar205._28_36_;
        auVar211._24_4_ = auVar115._24_4_ * fStack_6c8;
        auVar104 = vmulps_avx512vl(local_3e0,auVar115);
        auVar105 = vfmadd231ps_avx512vl(auVar212._0_32_,auVar116,local_680);
        auVar114 = vfmadd231ps_avx512vl(auVar211._0_32_,auVar116,local_6a0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,local_3c0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar117,local_640);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_660);
        auVar113 = vfmadd231ps_avx512vl(auVar104,auVar117,local_3a0);
        auVar97 = vfmadd231ps_fma(auVar105,auVar103,local_600);
        auVar211 = ZEXT1664(auVar97);
        auVar91 = vfmadd231ps_fma(auVar114,auVar103,local_620);
        auVar205 = ZEXT1664(auVar91);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 * 4 + lVar85);
        auVar105 = *(undefined1 (*) [32])(lVar85 + 0x21fdb88 + lVar83 * 4);
        auVar108 = vfmadd231ps_avx512vl(auVar113,auVar103,local_400);
        auVar114 = *(undefined1 (*) [32])(lVar85 + 0x21fe00c + lVar83 * 4);
        auVar113 = *(undefined1 (*) [32])(lVar85 + 0x21fe490 + lVar83 * 4);
        auVar218._0_4_ = auVar113._0_4_ * (float)local_6c0._0_4_;
        auVar218._4_4_ = auVar113._4_4_ * (float)local_6c0._4_4_;
        auVar218._8_4_ = auVar113._8_4_ * fStack_6b8;
        auVar218._12_4_ = auVar113._12_4_ * fStack_6b4;
        auVar218._16_4_ = auVar113._16_4_ * fStack_6b0;
        auVar218._20_4_ = auVar113._20_4_ * fStack_6ac;
        auVar218._28_36_ = auVar217._28_36_;
        auVar218._24_4_ = auVar113._24_4_ * fStack_6a8;
        auVar43._4_4_ = auVar113._4_4_ * (float)local_6e0._4_4_;
        auVar43._0_4_ = auVar113._0_4_ * (float)local_6e0._0_4_;
        auVar43._8_4_ = auVar113._8_4_ * fStack_6d8;
        auVar43._12_4_ = auVar113._12_4_ * fStack_6d4;
        auVar43._16_4_ = auVar113._16_4_ * fStack_6d0;
        auVar43._20_4_ = auVar113._20_4_ * fStack_6cc;
        auVar43._24_4_ = auVar113._24_4_ * fStack_6c8;
        auVar43._28_4_ = uStack_6c4;
        auVar106 = vmulps_avx512vl(local_3e0,auVar113);
        auVar107 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar114,local_680);
        auVar109 = vfmadd231ps_avx512vl(auVar43,auVar114,local_6a0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_3c0);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_640);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_660);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_3a0);
        auVar99 = vfmadd231ps_fma(auVar107,auVar104,local_600);
        auVar217 = ZEXT1664(auVar99);
        auVar23 = vfmadd231ps_fma(auVar109,auVar104,local_620);
        auVar109 = vfmadd231ps_avx512vl(auVar106,auVar104,local_400);
        auVar110 = vmaxps_avx512vl(auVar108,auVar109);
        auVar106 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar97));
        auVar107 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar91));
        auVar111 = vmulps_avx512vl(ZEXT1632(auVar91),auVar106);
        auVar112 = vmulps_avx512vl(ZEXT1632(auVar97),auVar107);
        auVar111 = vsubps_avx512vl(auVar111,auVar112);
        auVar112 = vmulps_avx512vl(auVar107,auVar107);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar106,auVar106);
        auVar110 = vmulps_avx512vl(auVar110,auVar110);
        auVar110 = vmulps_avx512vl(auVar110,auVar112);
        auVar111 = vmulps_avx512vl(auVar111,auVar111);
        uVar27 = vcmpps_avx512vl(auVar111,auVar110,2);
        bVar87 = (byte)uVar29 & (byte)uVar27;
        if (bVar87 != 0) {
          in_ZMM25 = ZEXT3264(local_4a0);
          auVar113 = vmulps_avx512vl(local_4a0,auVar113);
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_480,auVar113);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_460,auVar114);
          local_7a0 = auVar233._0_32_;
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_7a0,auVar105);
          auVar115 = vmulps_avx512vl(local_4a0,auVar115);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_480,auVar115);
          auVar117 = vfmadd213ps_avx512vl(auVar117,local_460,auVar116);
          auVar105 = vfmadd213ps_avx512vl(auVar103,local_7a0,auVar117);
          auVar103 = *(undefined1 (*) [32])(lVar85 + 0x21fc4f4 + lVar83 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21fc978 + lVar83 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar85 + 0x21fcdfc + lVar83 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar85 + 0x21fd280 + lVar83 * 4);
          auVar114 = vmulps_avx512vl(_local_6c0,auVar115);
          auVar113 = vmulps_avx512vl(_local_6e0,auVar115);
          auVar115 = vmulps_avx512vl(local_4a0,auVar115);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_680);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_6a0);
          auVar116 = vfmadd231ps_avx512vl(auVar115,local_480,auVar116);
          auVar115 = vfmadd231ps_avx512vl(auVar114,auVar117,local_640);
          auVar114 = vfmadd231ps_avx512vl(auVar113,auVar117,local_660);
          auVar117 = vfmadd231ps_avx512vl(auVar116,local_460,auVar117);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar103,local_600);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar103,local_620);
          auVar113 = vfmadd231ps_avx512vl(auVar117,local_7a0,auVar103);
          auVar103 = *(undefined1 (*) [32])(lVar85 + 0x21fe914 + lVar83 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21ff21c + lVar83 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar85 + 0x21ff6a0 + lVar83 * 4);
          auVar110 = vmulps_avx512vl(_local_6c0,auVar116);
          auVar111 = vmulps_avx512vl(_local_6e0,auVar116);
          auVar116 = vmulps_avx512vl(local_4a0,auVar116);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar117,local_680);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,local_6a0);
          auVar116 = vfmadd231ps_avx512vl(auVar116,local_480,auVar117);
          auVar117 = *(undefined1 (*) [32])(lVar85 + 0x21fed98 + lVar83 * 4);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar117,local_640);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,local_660);
          auVar117 = vfmadd231ps_avx512vl(auVar116,local_460,auVar117);
          auVar116 = vfmadd231ps_avx512vl(auVar110,auVar103,local_600);
          auVar110 = vfmadd231ps_avx512vl(auVar111,auVar103,local_620);
          auVar117 = vfmadd231ps_avx512vl(auVar117,local_7a0,auVar103);
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar115,auVar111);
          vandps_avx512vl(auVar114,auVar111);
          auVar103 = vmaxps_avx(auVar111,auVar111);
          vandps_avx512vl(auVar113,auVar111);
          auVar103 = vmaxps_avx(auVar103,auVar111);
          auVar73._4_4_ = fStack_77c;
          auVar73._0_4_ = local_780;
          auVar73._8_4_ = fStack_778;
          auVar73._12_4_ = fStack_774;
          auVar73._16_4_ = fStack_770;
          auVar73._20_4_ = fStack_76c;
          auVar73._24_4_ = fStack_768;
          auVar73._28_4_ = fStack_764;
          uVar77 = vcmpps_avx512vl(auVar103,auVar73,1);
          bVar9 = (bool)((byte)uVar77 & 1);
          auVar128._0_4_ = (float)((uint)bVar9 * auVar106._0_4_ | (uint)!bVar9 * auVar115._0_4_);
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar9 * auVar106._4_4_ | (uint)!bVar9 * auVar115._4_4_);
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar9 * auVar106._8_4_ | (uint)!bVar9 * auVar115._8_4_);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar9 * auVar106._12_4_ | (uint)!bVar9 * auVar115._12_4_);
          bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar128._16_4_ = (float)((uint)bVar9 * auVar106._16_4_ | (uint)!bVar9 * auVar115._16_4_);
          bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar128._20_4_ = (float)((uint)bVar9 * auVar106._20_4_ | (uint)!bVar9 * auVar115._20_4_);
          bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar128._24_4_ = (float)((uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * auVar115._24_4_);
          bVar9 = SUB81(uVar77 >> 7,0);
          auVar128._28_4_ = (uint)bVar9 * auVar106._28_4_ | (uint)!bVar9 * auVar115._28_4_;
          bVar9 = (bool)((byte)uVar77 & 1);
          auVar129._0_4_ = (float)((uint)bVar9 * auVar107._0_4_ | (uint)!bVar9 * auVar114._0_4_);
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar9 * auVar107._4_4_ | (uint)!bVar9 * auVar114._4_4_);
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar9 * auVar107._8_4_ | (uint)!bVar9 * auVar114._8_4_);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar9 * auVar107._12_4_ | (uint)!bVar9 * auVar114._12_4_);
          bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar129._16_4_ = (float)((uint)bVar9 * auVar107._16_4_ | (uint)!bVar9 * auVar114._16_4_);
          bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar129._20_4_ = (float)((uint)bVar9 * auVar107._20_4_ | (uint)!bVar9 * auVar114._20_4_);
          bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar129._24_4_ = (float)((uint)bVar9 * auVar107._24_4_ | (uint)!bVar9 * auVar114._24_4_);
          bVar9 = SUB81(uVar77 >> 7,0);
          auVar129._28_4_ = (uint)bVar9 * auVar107._28_4_ | (uint)!bVar9 * auVar114._28_4_;
          vandps_avx512vl(auVar116,auVar111);
          vandps_avx512vl(auVar110,auVar111);
          auVar103 = vmaxps_avx(auVar129,auVar129);
          vandps_avx512vl(auVar117,auVar111);
          auVar103 = vmaxps_avx(auVar103,auVar129);
          uVar77 = vcmpps_avx512vl(auVar103,auVar73,1);
          bVar9 = (bool)((byte)uVar77 & 1);
          auVar130._0_4_ = (uint)bVar9 * auVar106._0_4_ | (uint)!bVar9 * auVar116._0_4_;
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar9 * auVar106._4_4_ | (uint)!bVar9 * auVar116._4_4_;
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar9 * auVar106._8_4_ | (uint)!bVar9 * auVar116._8_4_;
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar9 * auVar106._12_4_ | (uint)!bVar9 * auVar116._12_4_;
          bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar9 * auVar106._16_4_ | (uint)!bVar9 * auVar116._16_4_;
          bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar9 * auVar106._20_4_ | (uint)!bVar9 * auVar116._20_4_;
          bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * auVar116._24_4_;
          bVar9 = SUB81(uVar77 >> 7,0);
          auVar130._28_4_ = (uint)bVar9 * auVar106._28_4_ | (uint)!bVar9 * auVar116._28_4_;
          bVar9 = (bool)((byte)uVar77 & 1);
          auVar131._0_4_ = (float)((uint)bVar9 * auVar107._0_4_ | (uint)!bVar9 * auVar110._0_4_);
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar9 * auVar107._4_4_ | (uint)!bVar9 * auVar110._4_4_);
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar9 * auVar107._8_4_ | (uint)!bVar9 * auVar110._8_4_);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar9 * auVar107._12_4_ | (uint)!bVar9 * auVar110._12_4_);
          bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar131._16_4_ = (float)((uint)bVar9 * auVar107._16_4_ | (uint)!bVar9 * auVar110._16_4_);
          bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar131._20_4_ = (float)((uint)bVar9 * auVar107._20_4_ | (uint)!bVar9 * auVar110._20_4_);
          bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar131._24_4_ = (float)((uint)bVar9 * auVar107._24_4_ | (uint)!bVar9 * auVar110._24_4_);
          bVar9 = SUB81(uVar77 >> 7,0);
          auVar131._28_4_ = (uint)bVar9 * auVar107._28_4_ | (uint)!bVar9 * auVar110._28_4_;
          auVar223._8_4_ = 0x80000000;
          auVar223._0_8_ = 0x8000000080000000;
          auVar223._12_4_ = 0x80000000;
          auVar223._16_4_ = 0x80000000;
          auVar223._20_4_ = 0x80000000;
          auVar223._24_4_ = 0x80000000;
          auVar223._28_4_ = 0x80000000;
          auVar103 = vxorps_avx512vl(auVar130,auVar223);
          auVar102 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
          auVar117 = vfmadd213ps_avx512vl(auVar128,auVar128,ZEXT1632(auVar102));
          auVar24 = vfmadd231ps_fma(auVar117,auVar129,auVar129);
          auVar117 = vrsqrt14ps_avx512vl(ZEXT1632(auVar24));
          auVar232._8_4_ = 0xbf000000;
          auVar232._0_8_ = 0xbf000000bf000000;
          auVar232._12_4_ = 0xbf000000;
          auVar232._16_4_ = 0xbf000000;
          auVar232._20_4_ = 0xbf000000;
          auVar232._24_4_ = 0xbf000000;
          auVar232._28_4_ = 0xbf000000;
          fVar170 = auVar117._0_4_;
          fVar219 = auVar117._4_4_;
          fVar221 = auVar117._8_4_;
          fVar167 = auVar117._12_4_;
          fVar180 = auVar117._16_4_;
          fVar179 = auVar117._20_4_;
          fVar195 = auVar117._24_4_;
          auVar44._4_4_ = fVar219 * fVar219 * fVar219 * auVar24._4_4_ * -0.5;
          auVar44._0_4_ = fVar170 * fVar170 * fVar170 * auVar24._0_4_ * -0.5;
          auVar44._8_4_ = fVar221 * fVar221 * fVar221 * auVar24._8_4_ * -0.5;
          auVar44._12_4_ = fVar167 * fVar167 * fVar167 * auVar24._12_4_ * -0.5;
          auVar44._16_4_ = fVar180 * fVar180 * fVar180 * -0.0;
          auVar44._20_4_ = fVar179 * fVar179 * fVar179 * -0.0;
          auVar44._24_4_ = fVar195 * fVar195 * fVar195 * -0.0;
          auVar44._28_4_ = auVar129._28_4_;
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar117 = vfmadd231ps_avx512vl(auVar44,auVar116,auVar117);
          auVar45._4_4_ = auVar129._4_4_ * auVar117._4_4_;
          auVar45._0_4_ = auVar129._0_4_ * auVar117._0_4_;
          auVar45._8_4_ = auVar129._8_4_ * auVar117._8_4_;
          auVar45._12_4_ = auVar129._12_4_ * auVar117._12_4_;
          auVar45._16_4_ = auVar129._16_4_ * auVar117._16_4_;
          auVar45._20_4_ = auVar129._20_4_ * auVar117._20_4_;
          auVar45._24_4_ = auVar129._24_4_ * auVar117._24_4_;
          auVar45._28_4_ = 0;
          auVar46._4_4_ = auVar117._4_4_ * -auVar128._4_4_;
          auVar46._0_4_ = auVar117._0_4_ * -auVar128._0_4_;
          auVar46._8_4_ = auVar117._8_4_ * -auVar128._8_4_;
          auVar46._12_4_ = auVar117._12_4_ * -auVar128._12_4_;
          auVar46._16_4_ = auVar117._16_4_ * -auVar128._16_4_;
          auVar46._20_4_ = auVar117._20_4_ * -auVar128._20_4_;
          auVar46._24_4_ = auVar117._24_4_ * -auVar128._24_4_;
          auVar46._28_4_ = auVar129._28_4_;
          auVar115 = vmulps_avx512vl(auVar117,ZEXT1632(auVar102));
          auVar113 = ZEXT1632(auVar102);
          auVar117 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar113);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar131,auVar131);
          auVar114 = vrsqrt14ps_avx512vl(auVar117);
          auVar117 = vmulps_avx512vl(auVar117,auVar232);
          fVar170 = auVar114._0_4_;
          fVar219 = auVar114._4_4_;
          fVar221 = auVar114._8_4_;
          fVar167 = auVar114._12_4_;
          fVar180 = auVar114._16_4_;
          fVar179 = auVar114._20_4_;
          fVar195 = auVar114._24_4_;
          auVar47._4_4_ = fVar219 * fVar219 * fVar219 * auVar117._4_4_;
          auVar47._0_4_ = fVar170 * fVar170 * fVar170 * auVar117._0_4_;
          auVar47._8_4_ = fVar221 * fVar221 * fVar221 * auVar117._8_4_;
          auVar47._12_4_ = fVar167 * fVar167 * fVar167 * auVar117._12_4_;
          auVar47._16_4_ = fVar180 * fVar180 * fVar180 * auVar117._16_4_;
          auVar47._20_4_ = fVar179 * fVar179 * fVar179 * auVar117._20_4_;
          auVar47._24_4_ = fVar195 * fVar195 * fVar195 * auVar117._24_4_;
          auVar47._28_4_ = auVar117._28_4_;
          auVar117 = vfmadd231ps_avx512vl(auVar47,auVar116,auVar114);
          auVar48._4_4_ = auVar131._4_4_ * auVar117._4_4_;
          auVar48._0_4_ = auVar131._0_4_ * auVar117._0_4_;
          auVar48._8_4_ = auVar131._8_4_ * auVar117._8_4_;
          auVar48._12_4_ = auVar131._12_4_ * auVar117._12_4_;
          auVar48._16_4_ = auVar131._16_4_ * auVar117._16_4_;
          auVar48._20_4_ = auVar131._20_4_ * auVar117._20_4_;
          auVar48._24_4_ = auVar131._24_4_ * auVar117._24_4_;
          auVar48._28_4_ = auVar114._28_4_;
          auVar49._4_4_ = auVar117._4_4_ * auVar103._4_4_;
          auVar49._0_4_ = auVar117._0_4_ * auVar103._0_4_;
          auVar49._8_4_ = auVar117._8_4_ * auVar103._8_4_;
          auVar49._12_4_ = auVar117._12_4_ * auVar103._12_4_;
          auVar49._16_4_ = auVar117._16_4_ * auVar103._16_4_;
          auVar49._20_4_ = auVar117._20_4_ * auVar103._20_4_;
          auVar49._24_4_ = auVar117._24_4_ * auVar103._24_4_;
          auVar49._28_4_ = auVar103._28_4_;
          auVar103 = vmulps_avx512vl(auVar117,auVar113);
          auVar24 = vfmadd213ps_fma(auVar45,auVar108,ZEXT1632(auVar97));
          auVar25 = vfmadd213ps_fma(auVar46,auVar108,ZEXT1632(auVar91));
          auVar116 = vfmadd213ps_avx512vl(auVar115,auVar108,auVar105);
          auVar114 = vfmadd213ps_avx512vl(auVar48,auVar109,ZEXT1632(auVar99));
          auVar26 = vfnmadd213ps_fma(auVar45,auVar108,ZEXT1632(auVar97));
          auVar97 = vfmadd213ps_fma(auVar49,auVar109,ZEXT1632(auVar23));
          auVar94 = vfnmadd213ps_fma(auVar46,auVar108,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar103,auVar109,auVar104);
          auVar100 = vfnmadd231ps_fma(auVar105,auVar108,auVar115);
          auVar96 = vfnmadd213ps_fma(auVar48,auVar109,ZEXT1632(auVar99));
          auVar95 = vfnmadd213ps_fma(auVar49,auVar109,ZEXT1632(auVar23));
          auVar101 = vfnmadd231ps_fma(auVar104,auVar109,auVar103);
          auVar104 = vsubps_avx512vl(auVar114,ZEXT1632(auVar26));
          auVar103 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar94));
          auVar117 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar100));
          auVar50._4_4_ = auVar103._4_4_ * auVar100._4_4_;
          auVar50._0_4_ = auVar103._0_4_ * auVar100._0_4_;
          auVar50._8_4_ = auVar103._8_4_ * auVar100._8_4_;
          auVar50._12_4_ = auVar103._12_4_ * auVar100._12_4_;
          auVar50._16_4_ = auVar103._16_4_ * 0.0;
          auVar50._20_4_ = auVar103._20_4_ * 0.0;
          auVar50._24_4_ = auVar103._24_4_ * 0.0;
          auVar50._28_4_ = auVar115._28_4_;
          auVar99 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar94),auVar117);
          auVar51._4_4_ = auVar117._4_4_ * auVar26._4_4_;
          auVar51._0_4_ = auVar117._0_4_ * auVar26._0_4_;
          auVar51._8_4_ = auVar117._8_4_ * auVar26._8_4_;
          auVar51._12_4_ = auVar117._12_4_ * auVar26._12_4_;
          auVar51._16_4_ = auVar117._16_4_ * 0.0;
          auVar51._20_4_ = auVar117._20_4_ * 0.0;
          auVar51._24_4_ = auVar117._24_4_ * 0.0;
          auVar51._28_4_ = auVar117._28_4_;
          auVar23 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar100),auVar104);
          auVar52._4_4_ = auVar94._4_4_ * auVar104._4_4_;
          auVar52._0_4_ = auVar94._0_4_ * auVar104._0_4_;
          auVar52._8_4_ = auVar94._8_4_ * auVar104._8_4_;
          auVar52._12_4_ = auVar94._12_4_ * auVar104._12_4_;
          auVar52._16_4_ = auVar104._16_4_ * 0.0;
          auVar52._20_4_ = auVar104._20_4_ * 0.0;
          auVar52._24_4_ = auVar104._24_4_ * 0.0;
          auVar52._28_4_ = auVar104._28_4_;
          auVar93 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar26),auVar103);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar113,ZEXT1632(auVar23));
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,ZEXT1632(auVar99));
          auVar111 = ZEXT1632(auVar102);
          uVar77 = vcmpps_avx512vl(auVar103,auVar111,2);
          bVar76 = (byte)uVar77;
          fVar198 = (float)((uint)(bVar76 & 1) * auVar24._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * auVar96._0_4_);
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          fVar90 = (float)((uint)bVar9 * auVar24._4_4_ | (uint)!bVar9 * auVar96._4_4_);
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          fVar143 = (float)((uint)bVar9 * auVar24._8_4_ | (uint)!bVar9 * auVar96._8_4_);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          fVar145 = (float)((uint)bVar9 * auVar24._12_4_ | (uint)!bVar9 * auVar96._12_4_);
          auVar113 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar143,CONCAT44(fVar90,fVar198))));
          fVar89 = (float)((uint)(bVar76 & 1) * auVar25._0_4_ |
                          (uint)!(bool)(bVar76 & 1) * auVar95._0_4_);
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          fVar142 = (float)((uint)bVar9 * auVar25._4_4_ | (uint)!bVar9 * auVar95._4_4_);
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          fVar144 = (float)((uint)bVar9 * auVar25._8_4_ | (uint)!bVar9 * auVar95._8_4_);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          fVar146 = (float)((uint)bVar9 * auVar25._12_4_ | (uint)!bVar9 * auVar95._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar89))));
          auVar132._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar116._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar101._0_4_);
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar9 * auVar116._4_4_ | (uint)!bVar9 * auVar101._4_4_);
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar9 * auVar116._8_4_ | (uint)!bVar9 * auVar101._8_4_);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar9 * auVar116._12_4_ | (uint)!bVar9 * auVar101._12_4_);
          fVar170 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar116._16_4_);
          auVar132._16_4_ = fVar170;
          fVar219 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar116._20_4_);
          auVar132._20_4_ = fVar219;
          fVar221 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar116._24_4_);
          auVar132._24_4_ = fVar221;
          iVar1 = (uint)(byte)(uVar77 >> 7) * auVar116._28_4_;
          auVar132._28_4_ = iVar1;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar26),auVar114);
          auVar133._0_4_ =
               (uint)(bVar76 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar99._0_4_;
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * auVar99._4_4_;
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * auVar99._8_4_;
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * auVar99._12_4_;
          auVar133._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_;
          auVar133._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_;
          auVar133._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_;
          auVar133._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar97));
          auVar134._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar24._0_4_);
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * auVar24._4_4_);
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * auVar24._8_4_);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar134._12_4_ = (float)((uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * auVar24._12_4_);
          fVar167 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_);
          auVar134._16_4_ = fVar167;
          fVar180 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_);
          auVar134._20_4_ = fVar180;
          fVar179 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_);
          auVar134._24_4_ = fVar179;
          auVar134._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar91));
          auVar135._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar25._0_4_);
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * auVar25._4_4_);
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * auVar25._8_4_);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar135._12_4_ = (float)((uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * auVar25._12_4_);
          fVar197 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_);
          auVar135._16_4_ = fVar197;
          fVar195 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_);
          auVar135._20_4_ = fVar195;
          fVar196 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_);
          auVar135._24_4_ = fVar196;
          iVar2 = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar135._28_4_ = iVar2;
          auVar136._0_4_ =
               (uint)(bVar76 & 1) * (int)auVar26._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar114._0_4_;
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar9 * (int)auVar26._4_4_ | (uint)!bVar9 * auVar114._4_4_;
          bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar9 * (int)auVar26._8_4_ | (uint)!bVar9 * auVar114._8_4_;
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar9 * (int)auVar26._12_4_ | (uint)!bVar9 * auVar114._12_4_;
          auVar136._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar114._16_4_;
          auVar136._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar114._20_4_;
          auVar136._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar114._24_4_;
          auVar136._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar114._28_4_;
          bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar114 = vsubps_avx512vl(auVar136,auVar113);
          auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar94._12_4_ |
                                                   (uint)!bVar13 * auVar97._12_4_,
                                                   CONCAT48((uint)bVar11 * (int)auVar94._8_4_ |
                                                            (uint)!bVar11 * auVar97._8_4_,
                                                            CONCAT44((uint)bVar9 *
                                                                     (int)auVar94._4_4_ |
                                                                     (uint)!bVar9 * auVar97._4_4_,
                                                                     (uint)(bVar76 & 1) *
                                                                     (int)auVar94._0_4_ |
                                                                     (uint)!(bool)(bVar76 & 1) *
                                                                     auVar97._0_4_)))),auVar106);
          auVar211 = ZEXT3264(auVar117);
          auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar100._12_4_ |
                                                   (uint)!bVar14 * auVar91._12_4_,
                                                   CONCAT48((uint)bVar12 * (int)auVar100._8_4_ |
                                                            (uint)!bVar12 * auVar91._8_4_,
                                                            CONCAT44((uint)bVar10 *
                                                                     (int)auVar100._4_4_ |
                                                                     (uint)!bVar10 * auVar91._4_4_,
                                                                     (uint)(bVar76 & 1) *
                                                                     (int)auVar100._0_4_ |
                                                                     (uint)!(bool)(bVar76 & 1) *
                                                                     auVar91._0_4_)))),auVar132);
          auVar115 = vsubps_avx(auVar113,auVar133);
          auVar217 = ZEXT3264(auVar115);
          auVar104 = vsubps_avx(auVar106,auVar134);
          auVar105 = vsubps_avx(auVar132,auVar135);
          auVar53._4_4_ = auVar116._4_4_ * fVar90;
          auVar53._0_4_ = auVar116._0_4_ * fVar198;
          auVar53._8_4_ = auVar116._8_4_ * fVar143;
          auVar53._12_4_ = auVar116._12_4_ * fVar145;
          auVar53._16_4_ = auVar116._16_4_ * 0.0;
          auVar53._20_4_ = auVar116._20_4_ * 0.0;
          auVar53._24_4_ = auVar116._24_4_ * 0.0;
          auVar53._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar53,auVar132,auVar114);
          auVar193._0_4_ = fVar89 * auVar114._0_4_;
          auVar193._4_4_ = fVar142 * auVar114._4_4_;
          auVar193._8_4_ = fVar144 * auVar114._8_4_;
          auVar193._12_4_ = fVar146 * auVar114._12_4_;
          auVar193._16_4_ = auVar114._16_4_ * 0.0;
          auVar193._20_4_ = auVar114._20_4_ * 0.0;
          auVar193._24_4_ = auVar114._24_4_ * 0.0;
          auVar193._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar193,auVar113,auVar117);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar111,ZEXT1632(auVar97));
          auVar203._0_4_ = auVar117._0_4_ * auVar132._0_4_;
          auVar203._4_4_ = auVar117._4_4_ * auVar132._4_4_;
          auVar203._8_4_ = auVar117._8_4_ * auVar132._8_4_;
          auVar203._12_4_ = auVar117._12_4_ * auVar132._12_4_;
          auVar203._16_4_ = auVar117._16_4_ * fVar170;
          auVar203._20_4_ = auVar117._20_4_ * fVar219;
          auVar203._24_4_ = auVar117._24_4_ * fVar221;
          auVar203._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar203,auVar106,auVar116);
          auVar107 = vfmadd231ps_avx512vl(auVar103,auVar111,ZEXT1632(auVar97));
          auVar103 = vmulps_avx512vl(auVar105,auVar133);
          auVar103 = vfmsub231ps_avx512vl(auVar103,auVar115,auVar135);
          auVar54._4_4_ = auVar104._4_4_ * auVar135._4_4_;
          auVar54._0_4_ = auVar104._0_4_ * auVar135._0_4_;
          auVar54._8_4_ = auVar104._8_4_ * auVar135._8_4_;
          auVar54._12_4_ = auVar104._12_4_ * auVar135._12_4_;
          auVar54._16_4_ = auVar104._16_4_ * fVar197;
          auVar54._20_4_ = auVar104._20_4_ * fVar195;
          auVar54._24_4_ = auVar104._24_4_ * fVar196;
          auVar54._28_4_ = iVar2;
          auVar97 = vfmsub231ps_fma(auVar54,auVar134,auVar105);
          auVar204._0_4_ = auVar134._0_4_ * auVar115._0_4_;
          auVar204._4_4_ = auVar134._4_4_ * auVar115._4_4_;
          auVar204._8_4_ = auVar134._8_4_ * auVar115._8_4_;
          auVar204._12_4_ = auVar134._12_4_ * auVar115._12_4_;
          auVar204._16_4_ = fVar167 * auVar115._16_4_;
          auVar204._20_4_ = fVar180 * auVar115._20_4_;
          auVar204._24_4_ = fVar179 * auVar115._24_4_;
          auVar204._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar204,auVar104,auVar133);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar111,auVar103);
          auVar110 = vfmadd231ps_avx512vl(auVar103,auVar111,ZEXT1632(auVar97));
          auVar205 = ZEXT3264(auVar110);
          auVar103 = vmaxps_avx(auVar107,auVar110);
          uVar27 = vcmpps_avx512vl(auVar103,auVar111,2);
          bVar87 = bVar87 & (byte)uVar27;
          if (bVar87 != 0) {
            auVar55._4_4_ = auVar105._4_4_ * auVar117._4_4_;
            auVar55._0_4_ = auVar105._0_4_ * auVar117._0_4_;
            auVar55._8_4_ = auVar105._8_4_ * auVar117._8_4_;
            auVar55._12_4_ = auVar105._12_4_ * auVar117._12_4_;
            auVar55._16_4_ = auVar105._16_4_ * auVar117._16_4_;
            auVar55._20_4_ = auVar105._20_4_ * auVar117._20_4_;
            auVar55._24_4_ = auVar105._24_4_ * auVar117._24_4_;
            auVar55._28_4_ = auVar103._28_4_;
            auVar23 = vfmsub231ps_fma(auVar55,auVar104,auVar116);
            auVar56._4_4_ = auVar116._4_4_ * auVar115._4_4_;
            auVar56._0_4_ = auVar116._0_4_ * auVar115._0_4_;
            auVar56._8_4_ = auVar116._8_4_ * auVar115._8_4_;
            auVar56._12_4_ = auVar116._12_4_ * auVar115._12_4_;
            auVar56._16_4_ = auVar116._16_4_ * auVar115._16_4_;
            auVar56._20_4_ = auVar116._20_4_ * auVar115._20_4_;
            auVar56._24_4_ = auVar116._24_4_ * auVar115._24_4_;
            auVar56._28_4_ = auVar116._28_4_;
            auVar99 = vfmsub231ps_fma(auVar56,auVar114,auVar105);
            auVar57._4_4_ = auVar104._4_4_ * auVar114._4_4_;
            auVar57._0_4_ = auVar104._0_4_ * auVar114._0_4_;
            auVar57._8_4_ = auVar104._8_4_ * auVar114._8_4_;
            auVar57._12_4_ = auVar104._12_4_ * auVar114._12_4_;
            auVar57._16_4_ = auVar104._16_4_ * auVar114._16_4_;
            auVar57._20_4_ = auVar104._20_4_ * auVar114._20_4_;
            auVar57._24_4_ = auVar104._24_4_ * auVar114._24_4_;
            auVar57._28_4_ = auVar104._28_4_;
            auVar24 = vfmsub231ps_fma(auVar57,auVar115,auVar117);
            auVar97 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar24));
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT1632(auVar23),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar91));
            auVar34._8_4_ = 0x3f800000;
            auVar34._0_8_ = 0x3f8000003f800000;
            auVar34._12_4_ = 0x3f800000;
            auVar34._16_4_ = 0x3f800000;
            auVar34._20_4_ = 0x3f800000;
            auVar34._24_4_ = 0x3f800000;
            auVar34._28_4_ = 0x3f800000;
            auVar117 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar91),auVar34);
            auVar97 = vfmadd132ps_fma(auVar117,auVar103,auVar103);
            auVar211 = ZEXT1664(auVar97);
            auVar58._4_4_ = auVar24._4_4_ * auVar132._4_4_;
            auVar58._0_4_ = auVar24._0_4_ * auVar132._0_4_;
            auVar58._8_4_ = auVar24._8_4_ * auVar132._8_4_;
            auVar58._12_4_ = auVar24._12_4_ * auVar132._12_4_;
            auVar58._16_4_ = fVar170 * 0.0;
            auVar58._20_4_ = fVar219 * 0.0;
            auVar58._24_4_ = fVar221 * 0.0;
            auVar58._28_4_ = iVar1;
            auVar99 = vfmadd231ps_fma(auVar58,auVar106,ZEXT1632(auVar99));
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar113,ZEXT1632(auVar23));
            fVar170 = auVar97._0_4_;
            fVar219 = auVar97._4_4_;
            fVar221 = auVar97._8_4_;
            fVar167 = auVar97._12_4_;
            local_5a0._28_4_ = auVar103._28_4_;
            local_5a0._0_28_ =
                 ZEXT1628(CONCAT412(auVar99._12_4_ * fVar167,
                                    CONCAT48(auVar99._8_4_ * fVar221,
                                             CONCAT44(auVar99._4_4_ * fVar219,
                                                      auVar99._0_4_ * fVar170))));
            auVar217 = ZEXT3264(local_5a0);
            auVar74._4_4_ = uStack_75c;
            auVar74._0_4_ = local_760;
            auVar74._8_4_ = uStack_758;
            auVar74._12_4_ = uStack_754;
            auVar74._16_4_ = uStack_750;
            auVar74._20_4_ = uStack_74c;
            auVar74._24_4_ = uStack_748;
            auVar74._28_4_ = uStack_744;
            uVar27 = vcmpps_avx512vl(local_5a0,auVar74,0xd);
            uVar166 = *(undefined4 *)(ray + sVar86 * 4 + 0x200);
            auVar35._4_4_ = uVar166;
            auVar35._0_4_ = uVar166;
            auVar35._8_4_ = uVar166;
            auVar35._12_4_ = uVar166;
            auVar35._16_4_ = uVar166;
            auVar35._20_4_ = uVar166;
            auVar35._24_4_ = uVar166;
            auVar35._28_4_ = uVar166;
            uVar29 = vcmpps_avx512vl(local_5a0,auVar35,2);
            bVar87 = (byte)uVar27 & (byte)uVar29 & bVar87;
            if (bVar87 != 0) {
              uVar88 = vcmpps_avx512vl(ZEXT1632(auVar91),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar88 = bVar87 & uVar88;
              if ((char)uVar88 != '\0') {
                fVar180 = auVar107._0_4_ * fVar170;
                fVar179 = auVar107._4_4_ * fVar219;
                auVar59._4_4_ = fVar179;
                auVar59._0_4_ = fVar180;
                fVar195 = auVar107._8_4_ * fVar221;
                auVar59._8_4_ = fVar195;
                fVar196 = auVar107._12_4_ * fVar167;
                auVar59._12_4_ = fVar196;
                fVar197 = auVar107._16_4_ * 0.0;
                auVar59._16_4_ = fVar197;
                fVar198 = auVar107._20_4_ * 0.0;
                auVar59._20_4_ = fVar198;
                fVar89 = auVar107._24_4_ * 0.0;
                auVar59._24_4_ = fVar89;
                auVar59._28_4_ = auVar107._28_4_;
                auVar178._8_4_ = 0x3f800000;
                auVar178._0_8_ = 0x3f8000003f800000;
                auVar178._12_4_ = 0x3f800000;
                auVar178._16_4_ = 0x3f800000;
                auVar178._20_4_ = 0x3f800000;
                auVar178._24_4_ = 0x3f800000;
                auVar178._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar178,auVar59);
                local_5e0._0_4_ =
                     (float)((uint)(bVar76 & 1) * (int)fVar180 |
                            (uint)!(bool)(bVar76 & 1) * auVar103._0_4_);
                bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar9 * (int)fVar179 | (uint)!bVar9 * auVar103._4_4_);
                bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar9 * (int)fVar195 | (uint)!bVar9 * auVar103._8_4_);
                bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar9 * (int)fVar196 | (uint)!bVar9 * auVar103._12_4_);
                bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar9 * (int)fVar197 | (uint)!bVar9 * auVar103._16_4_);
                bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar9 * (int)fVar198 | (uint)!bVar9 * auVar103._20_4_);
                bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar9 * (int)fVar89 | (uint)!bVar9 * auVar103._24_4_);
                bVar9 = SUB81(uVar77 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar9 * auVar107._28_4_ | (uint)!bVar9 * auVar103._28_4_);
                auVar103 = vsubps_avx(auVar109,auVar108);
                auVar97 = vfmadd213ps_fma(auVar103,local_5e0,auVar108);
                uVar166 = *(undefined4 *)((long)local_7f8->ray_space + sVar86 * 4 + -0x40);
                auVar36._4_4_ = uVar166;
                auVar36._0_4_ = uVar166;
                auVar36._8_4_ = uVar166;
                auVar36._12_4_ = uVar166;
                auVar36._16_4_ = uVar166;
                auVar36._20_4_ = uVar166;
                auVar36._24_4_ = uVar166;
                auVar36._28_4_ = uVar166;
                auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar97._12_4_ + auVar97._12_4_,
                                                              CONCAT48(auVar97._8_4_ + auVar97._8_4_
                                                                       ,CONCAT44(auVar97._4_4_ +
                                                                                 auVar97._4_4_,
                                                                                 auVar97._0_4_ +
                                                                                 auVar97._0_4_)))),
                                           auVar36);
                uVar28 = vcmpps_avx512vl(local_5a0,auVar103,6);
                uVar88 = uVar88 & uVar28;
                bVar87 = (byte)uVar88;
                if (bVar87 != 0) {
                  auVar169._0_4_ = auVar110._0_4_ * fVar170;
                  auVar169._4_4_ = auVar110._4_4_ * fVar219;
                  auVar169._8_4_ = auVar110._8_4_ * fVar221;
                  auVar169._12_4_ = auVar110._12_4_ * fVar167;
                  auVar169._16_4_ = auVar110._16_4_ * 0.0;
                  auVar169._20_4_ = auVar110._20_4_ * 0.0;
                  auVar169._24_4_ = auVar110._24_4_ * 0.0;
                  auVar169._28_4_ = 0;
                  auVar194._8_4_ = 0x3f800000;
                  auVar194._0_8_ = 0x3f8000003f800000;
                  auVar194._12_4_ = 0x3f800000;
                  auVar194._16_4_ = 0x3f800000;
                  auVar194._20_4_ = 0x3f800000;
                  auVar194._24_4_ = 0x3f800000;
                  auVar194._28_4_ = 0x3f800000;
                  auVar103 = vsubps_avx(auVar194,auVar169);
                  auVar137._0_4_ =
                       (uint)(bVar76 & 1) * (int)auVar169._0_4_ |
                       (uint)!(bool)(bVar76 & 1) * auVar103._0_4_;
                  bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
                  auVar137._4_4_ = (uint)bVar9 * (int)auVar169._4_4_ | (uint)!bVar9 * auVar103._4_4_
                  ;
                  bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
                  auVar137._8_4_ = (uint)bVar9 * (int)auVar169._8_4_ | (uint)!bVar9 * auVar103._8_4_
                  ;
                  bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
                  auVar137._12_4_ =
                       (uint)bVar9 * (int)auVar169._12_4_ | (uint)!bVar9 * auVar103._12_4_;
                  bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
                  auVar137._16_4_ =
                       (uint)bVar9 * (int)auVar169._16_4_ | (uint)!bVar9 * auVar103._16_4_;
                  bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
                  auVar137._20_4_ =
                       (uint)bVar9 * (int)auVar169._20_4_ | (uint)!bVar9 * auVar103._20_4_;
                  bVar9 = (bool)((byte)(uVar77 >> 6) & 1);
                  auVar137._24_4_ =
                       (uint)bVar9 * (int)auVar169._24_4_ | (uint)!bVar9 * auVar103._24_4_;
                  auVar137._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar103._28_4_;
                  auVar37._8_4_ = 0x40000000;
                  auVar37._0_8_ = 0x4000000040000000;
                  auVar37._12_4_ = 0x40000000;
                  auVar37._16_4_ = 0x40000000;
                  auVar37._20_4_ = 0x40000000;
                  auVar37._24_4_ = 0x40000000;
                  auVar37._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar137,auVar194,auVar37);
                  local_580 = (undefined4)lVar83;
                  local_570 = local_860;
                  uStack_568 = uStack_858;
                  local_560 = local_880;
                  uStack_558 = uStack_878;
                  local_550 = local_890;
                  uStack_548 = uStack_888;
                  local_540 = local_870;
                  uStack_538 = uStack_868;
                  pGVar82 = (context->scene->geometries).items[uVar5].ptr;
                  if ((pGVar82->mask & *(uint *)(ray + sVar86 * 4 + 0x240)) != 0) {
                    auVar97 = vcvtsi2ss_avx512f(auVar102,local_580);
                    fVar170 = auVar97._0_4_;
                    local_520[0] = (fVar170 + local_5e0._0_4_ + 0.0) * local_420;
                    local_520[1] = (fVar170 + local_5e0._4_4_ + 1.0) * fStack_41c;
                    local_520[2] = (fVar170 + local_5e0._8_4_ + 2.0) * fStack_418;
                    local_520[3] = (fVar170 + local_5e0._12_4_ + 3.0) * fStack_414;
                    fStack_510 = (fVar170 + local_5e0._16_4_ + 4.0) * fStack_410;
                    fStack_50c = (fVar170 + local_5e0._20_4_ + 5.0) * fStack_40c;
                    fStack_508 = (fVar170 + local_5e0._24_4_ + 6.0) * fStack_408;
                    fStack_504 = fVar170 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    auVar157._8_4_ = 0x7f800000;
                    auVar157._0_8_ = 0x7f8000007f800000;
                    auVar157._12_4_ = 0x7f800000;
                    auVar157._16_4_ = 0x7f800000;
                    auVar157._20_4_ = 0x7f800000;
                    auVar157._24_4_ = 0x7f800000;
                    auVar157._28_4_ = 0x7f800000;
                    auVar103 = vblendmps_avx512vl(auVar157,local_5a0);
                    auVar138._0_4_ =
                         (uint)(bVar87 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                    bVar9 = (bool)((byte)(uVar88 >> 1) & 1);
                    auVar138._4_4_ = (uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)((byte)(uVar88 >> 2) & 1);
                    auVar138._8_4_ = (uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)((byte)(uVar88 >> 3) & 1);
                    auVar138._12_4_ = (uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)((byte)(uVar88 >> 4) & 1);
                    auVar138._16_4_ = (uint)bVar9 * auVar103._16_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)((byte)(uVar88 >> 5) & 1);
                    auVar138._20_4_ = (uint)bVar9 * auVar103._20_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = (bool)((byte)(uVar88 >> 6) & 1);
                    auVar138._24_4_ = (uint)bVar9 * auVar103._24_4_ | (uint)!bVar9 * 0x7f800000;
                    bVar9 = SUB81(uVar88 >> 7,0);
                    auVar138._28_4_ = (uint)bVar9 * auVar103._28_4_ | (uint)!bVar9 * 0x7f800000;
                    auVar103 = vshufps_avx(auVar138,auVar138,0xb1);
                    auVar103 = vminps_avx(auVar138,auVar103);
                    auVar117 = vshufpd_avx(auVar103,auVar103,5);
                    auVar103 = vminps_avx(auVar103,auVar117);
                    auVar117 = vpermpd_avx2(auVar103,0x4e);
                    auVar103 = vminps_avx(auVar103,auVar117);
                    uVar27 = vcmpps_avx512vl(auVar138,auVar103,0);
                    uVar78 = (uint)uVar88;
                    if ((bVar87 & (byte)uVar27) != 0) {
                      uVar78 = (uint)(bVar87 & (byte)uVar27);
                    }
                    uVar79 = 0;
                    for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                      uVar79 = uVar79 + 1;
                    }
                    uVar77 = (ulong)uVar79;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar82->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = vmovdqa64_avx512vl(auVar141._0_32_);
                      local_820 = ZEXT416(*(uint *)(ray + sVar86 * 4 + 0x200));
                      local_7e0._0_8_ = pGVar82;
                      local_7c0 = local_5a0;
                      local_57c = iVar6;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar77]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar77 * 4)))
                        ;
                        *(undefined4 *)(ray + sVar86 * 4 + 0x200) =
                             *(undefined4 *)(local_4e0 + uVar77 * 4);
                        local_850.context = context->user;
                        fVar167 = local_200._0_4_;
                        fVar219 = 1.0 - fVar167;
                        fVar170 = fVar219 * fVar219 * -3.0;
                        auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219)),
                                                  ZEXT416((uint)(fVar167 * fVar219)),
                                                  ZEXT416(0xc0000000));
                        auVar91 = vfmsub132ss_fma(ZEXT416((uint)(fVar167 * fVar219)),
                                                  ZEXT416((uint)(fVar167 * fVar167)),
                                                  ZEXT416(0x40000000));
                        fVar219 = auVar97._0_4_ * 3.0;
                        fVar221 = auVar91._0_4_ * 3.0;
                        fVar167 = fVar167 * fVar167 * 3.0;
                        auVar209._0_4_ = fVar167 * fVar163;
                        auVar209._4_4_ = fVar167 * fVar164;
                        auVar209._8_4_ = fVar167 * fVar165;
                        auVar209._12_4_ = fVar167 * fVar75;
                        auVar150._4_4_ = fVar221;
                        auVar150._0_4_ = fVar221;
                        auVar150._8_4_ = fVar221;
                        auVar150._12_4_ = fVar221;
                        auVar97 = vfmadd132ps_fma(auVar150,auVar209,auVar92);
                        auVar189._4_4_ = fVar219;
                        auVar189._0_4_ = fVar219;
                        auVar189._8_4_ = fVar219;
                        auVar189._12_4_ = fVar219;
                        auVar97 = vfmadd132ps_fma(auVar189,auVar97,auVar148);
                        auVar151._4_4_ = fVar170;
                        auVar151._0_4_ = fVar170;
                        auVar151._8_4_ = fVar170;
                        auVar151._12_4_ = fVar170;
                        auVar97 = vfmadd132ps_fma(auVar151,auVar97,auVar98);
                        auVar162 = vbroadcastss_avx512f(auVar97);
                        auVar234 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar205 = vpermps_avx512f(auVar234,ZEXT1664(auVar97));
                        auVar211 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar211,ZEXT1664(auVar97));
                        local_2c0[0] = (RTCHitN)auVar162[0];
                        local_2c0[1] = (RTCHitN)auVar162[1];
                        local_2c0[2] = (RTCHitN)auVar162[2];
                        local_2c0[3] = (RTCHitN)auVar162[3];
                        local_2c0[4] = (RTCHitN)auVar162[4];
                        local_2c0[5] = (RTCHitN)auVar162[5];
                        local_2c0[6] = (RTCHitN)auVar162[6];
                        local_2c0[7] = (RTCHitN)auVar162[7];
                        local_2c0[8] = (RTCHitN)auVar162[8];
                        local_2c0[9] = (RTCHitN)auVar162[9];
                        local_2c0[10] = (RTCHitN)auVar162[10];
                        local_2c0[0xb] = (RTCHitN)auVar162[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar162[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar162[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar162[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar162[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar162[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar162[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar162[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar162[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar162[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar162[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar162[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar162[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar162[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar162[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar162[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar162[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar162[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar162[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar162[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar162[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar162[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar162[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar162[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar162[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar162[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar162[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar162[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar162[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar162[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar162[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar162[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar162[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar162[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar162[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar162[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar162[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar162[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar162[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar162[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar162[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar162[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar162[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar162[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar162[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar162[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar162[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar162[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar162[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar162[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar162[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar162[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar162[0x3f];
                        local_280 = auVar205;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar162 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar162);
                        auVar103 = vpcmpeqd_avx2(auVar162._0_32_,auVar162._0_32_);
                        local_800[3] = auVar103;
                        local_800[2] = auVar103;
                        local_800[1] = auVar103;
                        *local_800 = auVar103;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instPrimID[0]))
                        ;
                        auVar162 = vmovdqa64_avx512f(local_380);
                        local_740 = vmovdqa64_avx512f(auVar162);
                        local_850.valid = (int *)local_740;
                        local_850.geometryUserPtr = pGVar82->userPtr;
                        local_850.hit = local_2c0;
                        local_850.N = 0x10;
                        local_850.ray = (RTCRayN *)ray;
                        if (pGVar82->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar205 = ZEXT1664(auVar205._0_16_);
                          auVar211 = ZEXT1664(auVar211._0_16_);
                          (*pGVar82->intersectionFilterN)(&local_850);
                          auVar217 = ZEXT3264(local_7c0);
                          auVar162 = vmovdqa64_avx512f(local_740);
                          pGVar82 = (Geometry *)local_7e0._0_8_;
                        }
                        uVar27 = vptestmd_avx512f(auVar162,auVar162);
                        if ((short)uVar27 == 0) {
LAB_017d59fa:
                          *(undefined4 *)(ray + sVar86 * 4 + 0x200) = local_820._0_4_;
                        }
                        else {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar82->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar205 = ZEXT1664(auVar205._0_16_);
                            auVar211 = ZEXT1664(auVar211._0_16_);
                            (*p_Var8)(&local_850);
                            auVar217 = ZEXT3264(local_7c0);
                            auVar162 = vmovdqa64_avx512f(local_740);
                            pGVar82 = (Geometry *)local_7e0._0_8_;
                          }
                          uVar28 = vptestmd_avx512f(auVar162,auVar162);
                          if ((short)uVar28 == 0) goto LAB_017d59fa;
                          iVar1 = *(int *)(local_850.hit + 4);
                          iVar2 = *(int *)(local_850.hit + 8);
                          iVar60 = *(int *)(local_850.hit + 0xc);
                          iVar61 = *(int *)(local_850.hit + 0x10);
                          iVar62 = *(int *)(local_850.hit + 0x14);
                          iVar63 = *(int *)(local_850.hit + 0x18);
                          iVar64 = *(int *)(local_850.hit + 0x1c);
                          iVar65 = *(int *)(local_850.hit + 0x20);
                          iVar66 = *(int *)(local_850.hit + 0x24);
                          iVar67 = *(int *)(local_850.hit + 0x28);
                          iVar68 = *(int *)(local_850.hit + 0x2c);
                          iVar69 = *(int *)(local_850.hit + 0x30);
                          iVar70 = *(int *)(local_850.hit + 0x34);
                          iVar71 = *(int *)(local_850.hit + 0x38);
                          iVar72 = *(int *)(local_850.hit + 0x3c);
                          bVar87 = (byte)uVar28;
                          bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar76 = (byte)(uVar28 >> 8);
                          bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar22 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x300) =
                               (uint)(bVar87 & 1) * *(int *)local_850.hit |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x300);
                          *(uint *)(local_850.ray + 0x304) =
                               (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 0x304);
                          *(uint *)(local_850.ray + 0x308) =
                               (uint)bVar10 * iVar2 |
                               (uint)!bVar10 * *(int *)(local_850.ray + 0x308);
                          *(uint *)(local_850.ray + 0x30c) =
                               (uint)bVar11 * iVar60 |
                               (uint)!bVar11 * *(int *)(local_850.ray + 0x30c);
                          *(uint *)(local_850.ray + 0x310) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_850.ray + 0x310);
                          *(uint *)(local_850.ray + 0x314) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_850.ray + 0x314);
                          *(uint *)(local_850.ray + 0x318) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x318);
                          *(uint *)(local_850.ray + 0x31c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x31c);
                          *(uint *)(local_850.ray + 800) =
                               (uint)(bVar76 & 1) * iVar65 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 800);
                          *(uint *)(local_850.ray + 0x324) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x324);
                          *(uint *)(local_850.ray + 0x328) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x328);
                          *(uint *)(local_850.ray + 0x32c) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x32c);
                          *(uint *)(local_850.ray + 0x330) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x330);
                          *(uint *)(local_850.ray + 0x334) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x334);
                          *(uint *)(local_850.ray + 0x338) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x338);
                          *(uint *)(local_850.ray + 0x33c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x33c);
                          iVar1 = *(int *)(local_850.hit + 0x44);
                          iVar2 = *(int *)(local_850.hit + 0x48);
                          iVar60 = *(int *)(local_850.hit + 0x4c);
                          iVar61 = *(int *)(local_850.hit + 0x50);
                          iVar62 = *(int *)(local_850.hit + 0x54);
                          iVar63 = *(int *)(local_850.hit + 0x58);
                          iVar64 = *(int *)(local_850.hit + 0x5c);
                          iVar65 = *(int *)(local_850.hit + 0x60);
                          iVar66 = *(int *)(local_850.hit + 100);
                          iVar67 = *(int *)(local_850.hit + 0x68);
                          iVar68 = *(int *)(local_850.hit + 0x6c);
                          iVar69 = *(int *)(local_850.hit + 0x70);
                          iVar70 = *(int *)(local_850.hit + 0x74);
                          iVar71 = *(int *)(local_850.hit + 0x78);
                          iVar72 = *(int *)(local_850.hit + 0x7c);
                          bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar22 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x340) =
                               (uint)(bVar87 & 1) * *(int *)(local_850.hit + 0x40) |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x340);
                          *(uint *)(local_850.ray + 0x344) =
                               (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 0x344);
                          *(uint *)(local_850.ray + 0x348) =
                               (uint)bVar10 * iVar2 |
                               (uint)!bVar10 * *(int *)(local_850.ray + 0x348);
                          *(uint *)(local_850.ray + 0x34c) =
                               (uint)bVar11 * iVar60 |
                               (uint)!bVar11 * *(int *)(local_850.ray + 0x34c);
                          *(uint *)(local_850.ray + 0x350) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_850.ray + 0x350);
                          *(uint *)(local_850.ray + 0x354) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_850.ray + 0x354);
                          *(uint *)(local_850.ray + 0x358) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x358);
                          *(uint *)(local_850.ray + 0x35c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x35c);
                          *(uint *)(local_850.ray + 0x360) =
                               (uint)(bVar76 & 1) * iVar65 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 0x360);
                          *(uint *)(local_850.ray + 0x364) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x364);
                          *(uint *)(local_850.ray + 0x368) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x368);
                          *(uint *)(local_850.ray + 0x36c) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x36c);
                          *(uint *)(local_850.ray + 0x370) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x370);
                          *(uint *)(local_850.ray + 0x374) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x374);
                          *(uint *)(local_850.ray + 0x378) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x378);
                          *(uint *)(local_850.ray + 0x37c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x37c);
                          iVar1 = *(int *)(local_850.hit + 0x84);
                          iVar2 = *(int *)(local_850.hit + 0x88);
                          iVar60 = *(int *)(local_850.hit + 0x8c);
                          iVar61 = *(int *)(local_850.hit + 0x90);
                          iVar62 = *(int *)(local_850.hit + 0x94);
                          iVar63 = *(int *)(local_850.hit + 0x98);
                          iVar64 = *(int *)(local_850.hit + 0x9c);
                          iVar65 = *(int *)(local_850.hit + 0xa0);
                          iVar66 = *(int *)(local_850.hit + 0xa4);
                          iVar67 = *(int *)(local_850.hit + 0xa8);
                          iVar68 = *(int *)(local_850.hit + 0xac);
                          iVar69 = *(int *)(local_850.hit + 0xb0);
                          iVar70 = *(int *)(local_850.hit + 0xb4);
                          iVar71 = *(int *)(local_850.hit + 0xb8);
                          iVar72 = *(int *)(local_850.hit + 0xbc);
                          bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar22 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x380) =
                               (uint)(bVar87 & 1) * *(int *)(local_850.hit + 0x80) |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x380);
                          *(uint *)(local_850.ray + 900) =
                               (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 900);
                          *(uint *)(local_850.ray + 0x388) =
                               (uint)bVar10 * iVar2 |
                               (uint)!bVar10 * *(int *)(local_850.ray + 0x388);
                          *(uint *)(local_850.ray + 0x38c) =
                               (uint)bVar11 * iVar60 |
                               (uint)!bVar11 * *(int *)(local_850.ray + 0x38c);
                          *(uint *)(local_850.ray + 0x390) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_850.ray + 0x390);
                          *(uint *)(local_850.ray + 0x394) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_850.ray + 0x394);
                          *(uint *)(local_850.ray + 0x398) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x398);
                          *(uint *)(local_850.ray + 0x39c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x39c);
                          *(uint *)(local_850.ray + 0x3a0) =
                               (uint)(bVar76 & 1) * iVar65 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 0x3a0);
                          *(uint *)(local_850.ray + 0x3a4) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x3a4);
                          *(uint *)(local_850.ray + 0x3a8) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x3a8);
                          *(uint *)(local_850.ray + 0x3ac) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x3ac);
                          *(uint *)(local_850.ray + 0x3b0) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x3b0);
                          *(uint *)(local_850.ray + 0x3b4) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x3b4);
                          *(uint *)(local_850.ray + 0x3b8) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x3b8);
                          *(uint *)(local_850.ray + 0x3bc) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x3bc);
                          iVar1 = *(int *)(local_850.hit + 0xc4);
                          iVar2 = *(int *)(local_850.hit + 200);
                          iVar60 = *(int *)(local_850.hit + 0xcc);
                          iVar61 = *(int *)(local_850.hit + 0xd0);
                          iVar62 = *(int *)(local_850.hit + 0xd4);
                          iVar63 = *(int *)(local_850.hit + 0xd8);
                          iVar64 = *(int *)(local_850.hit + 0xdc);
                          iVar65 = *(int *)(local_850.hit + 0xe0);
                          iVar66 = *(int *)(local_850.hit + 0xe4);
                          iVar67 = *(int *)(local_850.hit + 0xe8);
                          iVar68 = *(int *)(local_850.hit + 0xec);
                          iVar69 = *(int *)(local_850.hit + 0xf0);
                          iVar70 = *(int *)(local_850.hit + 0xf4);
                          iVar71 = *(int *)(local_850.hit + 0xf8);
                          iVar72 = *(int *)(local_850.hit + 0xfc);
                          bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar22 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x3c0) =
                               (uint)(bVar87 & 1) * *(int *)(local_850.hit + 0xc0) |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x3c0);
                          *(uint *)(local_850.ray + 0x3c4) =
                               (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 0x3c4);
                          *(uint *)(local_850.ray + 0x3c8) =
                               (uint)bVar10 * iVar2 |
                               (uint)!bVar10 * *(int *)(local_850.ray + 0x3c8);
                          *(uint *)(local_850.ray + 0x3cc) =
                               (uint)bVar11 * iVar60 |
                               (uint)!bVar11 * *(int *)(local_850.ray + 0x3cc);
                          *(uint *)(local_850.ray + 0x3d0) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_850.ray + 0x3d0);
                          *(uint *)(local_850.ray + 0x3d4) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_850.ray + 0x3d4);
                          *(uint *)(local_850.ray + 0x3d8) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x3d8);
                          *(uint *)(local_850.ray + 0x3dc) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x3dc);
                          *(uint *)(local_850.ray + 0x3e0) =
                               (uint)(bVar76 & 1) * iVar65 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 0x3e0);
                          *(uint *)(local_850.ray + 0x3e4) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x3e4);
                          *(uint *)(local_850.ray + 1000) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 1000);
                          *(uint *)(local_850.ray + 0x3ec) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x3ec);
                          *(uint *)(local_850.ray + 0x3f0) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x3f0);
                          *(uint *)(local_850.ray + 0x3f4) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x3f4);
                          *(uint *)(local_850.ray + 0x3f8) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x3f8);
                          *(uint *)(local_850.ray + 0x3fc) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x3fc);
                          iVar1 = *(int *)(local_850.hit + 0x104);
                          iVar2 = *(int *)(local_850.hit + 0x108);
                          iVar60 = *(int *)(local_850.hit + 0x10c);
                          iVar61 = *(int *)(local_850.hit + 0x110);
                          iVar62 = *(int *)(local_850.hit + 0x114);
                          iVar63 = *(int *)(local_850.hit + 0x118);
                          iVar64 = *(int *)(local_850.hit + 0x11c);
                          iVar65 = *(int *)(local_850.hit + 0x120);
                          iVar66 = *(int *)(local_850.hit + 0x124);
                          iVar67 = *(int *)(local_850.hit + 0x128);
                          iVar68 = *(int *)(local_850.hit + 300);
                          iVar69 = *(int *)(local_850.hit + 0x130);
                          iVar70 = *(int *)(local_850.hit + 0x134);
                          iVar71 = *(int *)(local_850.hit + 0x138);
                          iVar72 = *(int *)(local_850.hit + 0x13c);
                          bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar22 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_850.ray + 0x400) =
                               (uint)(bVar87 & 1) * *(int *)(local_850.hit + 0x100) |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_850.ray + 0x400);
                          *(uint *)(local_850.ray + 0x404) =
                               (uint)bVar9 * iVar1 | (uint)!bVar9 * *(int *)(local_850.ray + 0x404);
                          *(uint *)(local_850.ray + 0x408) =
                               (uint)bVar10 * iVar2 |
                               (uint)!bVar10 * *(int *)(local_850.ray + 0x408);
                          *(uint *)(local_850.ray + 0x40c) =
                               (uint)bVar11 * iVar60 |
                               (uint)!bVar11 * *(int *)(local_850.ray + 0x40c);
                          *(uint *)(local_850.ray + 0x410) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_850.ray + 0x410);
                          *(uint *)(local_850.ray + 0x414) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_850.ray + 0x414);
                          *(uint *)(local_850.ray + 0x418) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_850.ray + 0x418);
                          *(uint *)(local_850.ray + 0x41c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_850.ray + 0x41c);
                          *(uint *)(local_850.ray + 0x420) =
                               (uint)(bVar76 & 1) * iVar65 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_850.ray + 0x420);
                          *(uint *)(local_850.ray + 0x424) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_850.ray + 0x424);
                          *(uint *)(local_850.ray + 0x428) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_850.ray + 0x428);
                          *(uint *)(local_850.ray + 0x42c) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_850.ray + 0x42c);
                          *(uint *)(local_850.ray + 0x430) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_850.ray + 0x430);
                          *(uint *)(local_850.ray + 0x434) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_850.ray + 0x434);
                          *(uint *)(local_850.ray + 0x438) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_850.ray + 0x438);
                          *(uint *)(local_850.ray + 0x43c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_850.ray + 0x43c);
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x140)
                                                      );
                          auVar162 = vmovdqu32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_850.ray + 0x440) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x180)
                                                      );
                          auVar162 = vmovdqu32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_850.ray + 0x480) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x1c0)
                                                      );
                          auVar162 = vmovdqa32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_850.ray + 0x4c0) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_850.hit + 0x200)
                                                      );
                          auVar162 = vmovdqa32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_850.ray + 0x500) = auVar162;
                          local_820._0_4_ = *(undefined4 *)(ray + sVar86 * 4 + 0x200);
                          local_820._4_4_ = 0;
                          local_820._8_4_ = 0;
                          local_820._12_4_ = 0;
                        }
                        bVar87 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & (byte)uVar88;
                        auVar158._4_4_ = local_820._0_4_;
                        auVar158._0_4_ = local_820._0_4_;
                        auVar158._8_4_ = local_820._0_4_;
                        auVar158._12_4_ = local_820._0_4_;
                        auVar158._16_4_ = local_820._0_4_;
                        auVar158._20_4_ = local_820._0_4_;
                        auVar158._24_4_ = local_820._0_4_;
                        auVar158._28_4_ = local_820._0_4_;
                        uVar27 = vcmpps_avx512vl(auVar217._0_32_,auVar158,2);
                        if ((bVar87 & (byte)uVar27) == 0) goto LAB_017d5a9a;
                        bVar87 = bVar87 & (byte)uVar27;
                        uVar88 = (ulong)bVar87;
                        auVar159._8_4_ = 0x7f800000;
                        auVar159._0_8_ = 0x7f8000007f800000;
                        auVar159._12_4_ = 0x7f800000;
                        auVar159._16_4_ = 0x7f800000;
                        auVar159._20_4_ = 0x7f800000;
                        auVar159._24_4_ = 0x7f800000;
                        auVar159._28_4_ = 0x7f800000;
                        auVar103 = vblendmps_avx512vl(auVar159,auVar217._0_32_);
                        auVar139._0_4_ =
                             (uint)(bVar87 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                        bVar9 = (bool)(bVar87 >> 1 & 1);
                        auVar139._4_4_ = (uint)bVar9 * auVar103._4_4_ | (uint)!bVar9 * 0x7f800000;
                        bVar9 = (bool)(bVar87 >> 2 & 1);
                        auVar139._8_4_ = (uint)bVar9 * auVar103._8_4_ | (uint)!bVar9 * 0x7f800000;
                        bVar9 = (bool)(bVar87 >> 3 & 1);
                        auVar139._12_4_ = (uint)bVar9 * auVar103._12_4_ | (uint)!bVar9 * 0x7f800000;
                        bVar9 = (bool)(bVar87 >> 4 & 1);
                        auVar139._16_4_ = (uint)bVar9 * auVar103._16_4_ | (uint)!bVar9 * 0x7f800000;
                        bVar9 = (bool)(bVar87 >> 5 & 1);
                        auVar139._20_4_ = (uint)bVar9 * auVar103._20_4_ | (uint)!bVar9 * 0x7f800000;
                        bVar9 = (bool)(bVar87 >> 6 & 1);
                        auVar139._24_4_ = (uint)bVar9 * auVar103._24_4_ | (uint)!bVar9 * 0x7f800000;
                        auVar139._28_4_ =
                             (uint)(bVar87 >> 7) * auVar103._28_4_ |
                             (uint)!(bool)(bVar87 >> 7) * 0x7f800000;
                        auVar103 = vshufps_avx(auVar139,auVar139,0xb1);
                        auVar103 = vminps_avx(auVar139,auVar103);
                        auVar117 = vshufpd_avx(auVar103,auVar103,5);
                        auVar103 = vminps_avx(auVar103,auVar117);
                        auVar117 = vpermpd_avx2(auVar103,0x4e);
                        auVar103 = vminps_avx(auVar103,auVar117);
                        uVar27 = vcmpps_avx512vl(auVar139,auVar103,0);
                        bVar76 = (byte)uVar27 & bVar87;
                        if (bVar76 != 0) {
                          bVar87 = bVar76;
                        }
                        uVar78 = 0;
                        for (uVar79 = (uint)bVar87; (uVar79 & 1) == 0;
                            uVar79 = uVar79 >> 1 | 0x80000000) {
                          uVar78 = uVar78 + 1;
                        }
                        uVar77 = (ulong)uVar78;
                      } while( true );
                    }
                    fVar170 = local_520[uVar77];
                    uVar166 = *(undefined4 *)(local_500 + uVar77 * 4);
                    fVar221 = 1.0 - fVar170;
                    fVar219 = fVar221 * fVar221 * -3.0;
                    auVar205 = ZEXT464((uint)fVar219);
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar221)),
                                              ZEXT416((uint)(fVar170 * fVar221)),ZEXT416(0xc0000000)
                                             );
                    auVar91 = vfmsub132ss_fma(ZEXT416((uint)(fVar170 * fVar221)),
                                              ZEXT416((uint)(fVar170 * fVar170)),ZEXT416(0x40000000)
                                             );
                    fVar221 = auVar97._0_4_ * 3.0;
                    fVar167 = auVar91._0_4_ * 3.0;
                    fVar180 = fVar170 * fVar170 * 3.0;
                    auVar208._0_4_ = fVar180 * fVar163;
                    auVar208._4_4_ = fVar180 * fVar164;
                    auVar208._8_4_ = fVar180 * fVar165;
                    auVar208._12_4_ = fVar180 * fVar75;
                    auVar211 = ZEXT1664(auVar208);
                    auVar175._4_4_ = fVar167;
                    auVar175._0_4_ = fVar167;
                    auVar175._8_4_ = fVar167;
                    auVar175._12_4_ = fVar167;
                    auVar97 = vfmadd132ps_fma(auVar175,auVar208,auVar92);
                    auVar188._4_4_ = fVar221;
                    auVar188._0_4_ = fVar221;
                    auVar188._8_4_ = fVar221;
                    auVar188._12_4_ = fVar221;
                    auVar97 = vfmadd132ps_fma(auVar188,auVar97,auVar148);
                    auVar176._4_4_ = fVar219;
                    auVar176._0_4_ = fVar219;
                    auVar176._8_4_ = fVar219;
                    auVar176._12_4_ = fVar219;
                    auVar97 = vfmadd132ps_fma(auVar176,auVar97,auVar98);
                    *(undefined4 *)(ray + sVar86 * 4 + 0x200) =
                         *(undefined4 *)(local_4e0 + uVar77 * 4);
                    *(int *)(ray + sVar86 * 4 + 0x300) = auVar97._0_4_;
                    uVar7 = vextractps_avx(auVar97,1);
                    *(undefined4 *)(ray + sVar86 * 4 + 0x340) = uVar7;
                    uVar7 = vextractps_avx(auVar97,2);
                    *(undefined4 *)(ray + sVar86 * 4 + 0x380) = uVar7;
                    *(float *)(ray + sVar86 * 4 + 0x3c0) = fVar170;
                    *(undefined4 *)(ray + sVar86 * 4 + 0x400) = uVar166;
                    *(int *)(ray + sVar86 * 4 + 0x440) = (int)local_7f0;
                    *(uint *)(ray + sVar86 * 4 + 0x480) = uVar5;
                    *(uint *)(ray + sVar86 * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + sVar86 * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_017d56c0;
      }
    }
    uVar166 = *(undefined4 *)(ray + sVar86 * 4 + 0x200);
    auVar31._4_4_ = uVar166;
    auVar31._0_4_ = uVar166;
    auVar31._8_4_ = uVar166;
    auVar31._12_4_ = uVar166;
    uVar27 = vcmpps_avx512vl(local_4b0,auVar31,2);
    uVar84 = (ulong)((uint)uVar84 & (uint)uVar84 + 0xf & (uint)uVar27);
  } while( true );
LAB_017d5a9a:
  auVar103 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar162 = ZEXT3264(auVar103);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar234 = ZEXT3264(auVar103);
  auVar233 = ZEXT3264(local_7a0);
  auVar103 = vmovdqa64_avx512vl(local_440);
  auVar141 = ZEXT3264(auVar103);
LAB_017d56c0:
  lVar83 = lVar83 + 8;
  goto LAB_017d4df7;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }